

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance_array_intersector.cpp
# Opt level: O1

vbool<4> __thiscall
embree::avx2::InstanceArrayIntersectorKMB<4>::occluded
          (InstanceArrayIntersectorKMB<4> *this,vbool<4> *valid_i,Precalculations *pre,RayK<4> *ray,
          RayQueryContext *context,Primitive_conflict4 *prim)

{
  RayK<4> *pRVar1;
  long *plVar2;
  uint uVar3;
  int iVar4;
  RTCRayQueryContext *pRVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [12];
  undefined8 uVar12;
  undefined1 auVar13 [16];
  ulong uVar14;
  _func_int *p_Var15;
  Geometry *extraout_RDX;
  Geometry *pGVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  undefined4 uVar22;
  float fVar23;
  float fVar65;
  float fVar66;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  float fVar67;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar154;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar196;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  float fVar194;
  float fVar195;
  undefined1 in_ZMM4 [64];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 in_ZMM5 [64];
  float fVar221;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar238;
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  float fVar236;
  float fVar237;
  undefined1 in_ZMM6 [64];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 in_ZMM7 [64];
  float fVar251;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  float fVar270;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar267;
  float fVar269;
  float fVar271;
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  float fVar266;
  float fVar268;
  undefined1 in_ZMM8 [64];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar288;
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 in_ZMM9 [64];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [16];
  undefined1 auVar303 [16];
  undefined1 in_ZMM10 [64];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [16];
  undefined1 auVar335 [16];
  undefined1 auVar336 [16];
  undefined1 auVar337 [16];
  undefined1 auVar338 [16];
  undefined1 auVar339 [16];
  undefined1 auVar340 [16];
  undefined1 auVar341 [16];
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar344 [16];
  undefined1 auVar345 [16];
  undefined1 auVar346 [16];
  undefined1 auVar347 [16];
  undefined1 auVar348 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar349 [16];
  undefined1 auVar350 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 in_ZMM14 [64];
  undefined1 auVar353 [16];
  undefined1 auVar354 [16];
  undefined1 auVar355 [16];
  undefined1 auVar356 [16];
  undefined1 auVar357 [16];
  float fVar360;
  undefined1 auVar358 [16];
  undefined1 auVar359 [16];
  undefined1 in_ZMM15 [64];
  vbool<4> vVar361;
  RayQueryContext newcontext;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  undefined1 local_378 [8];
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [8];
  float fStack_360;
  float fStack_35c;
  undefined1 local_358 [8];
  undefined8 uStack_350;
  undefined1 local_348 [8];
  undefined8 uStack_340;
  undefined1 local_338 [8];
  undefined8 uStack_330;
  undefined1 local_328 [8];
  undefined8 uStack_320;
  undefined1 local_318 [8];
  float fStack_310;
  float fStack_30c;
  undefined1 local_308 [8];
  float fStack_300;
  float fStack_2fc;
  undefined1 local_2f8 [8];
  undefined8 uStack_2f0;
  undefined1 local_2e8 [8];
  undefined8 uStack_2e0;
  undefined1 local_2d8 [8];
  float fStack_2d0;
  float fStack_2cc;
  undefined1 local_2c8 [8];
  float fStack_2c0;
  float fStack_2bc;
  undefined1 local_2b8 [16];
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  undefined1 local_298 [8];
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [8];
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  undefined1 local_d8 [16];
  undefined1 local_c8 [8];
  float fStack_c0;
  float fStack_bc;
  undefined1 local_b8 [16];
  undefined1 local_a8 [8];
  float fStack_a0;
  float fStack_9c;
  undefined1 local_98 [16];
  RTCIntersectArguments *local_88;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined8 local_28;
  undefined8 uStack_20;
  
  uVar12 = mm_lookupmask_ps._8_8_;
  auVar71 = in_ZMM13._0_16_;
  auVar353 = in_ZMM15._0_16_;
  auVar86 = in_ZMM5._0_16_;
  auVar225 = in_ZMM6._0_16_;
  auVar33 = in_ZMM4._0_16_;
  auVar35 = in_ZMM8._0_16_;
  auVar115 = in_ZMM7._0_16_;
  auVar273 = in_ZMM9._0_16_;
  auVar289 = in_ZMM10._0_16_;
  auVar34 = in_ZMM14._0_16_;
  uVar3 = prim->primID_;
  uVar19 = prim->instID_;
  pGVar16 = (context->scene->geometries).items[uVar19].ptr;
  p_Var15 = *(_func_int **)&pGVar16->field_0x58;
  if (p_Var15 == (_func_int *)0x0) {
    uVar14 = (ulong)*(uint *)(*(long *)&pGVar16[1].time_range.upper +
                             (long)pGVar16[1].intersectionFilterN * (ulong)uVar3);
    if (uVar14 == 0xffffffff) {
      p_Var15 = (_func_int *)0x0;
    }
    else {
      p_Var15 = pGVar16[1].super_RefCount._vptr_RefCount[uVar14];
    }
  }
  if (p_Var15 != (_func_int *)0x0) {
    uVar17 = pGVar16->mask;
    auVar24._4_4_ = uVar17;
    auVar24._0_4_ = uVar17;
    auVar24._8_4_ = uVar17;
    auVar24._12_4_ = uVar17;
    auVar24 = vpand_avx(auVar24,*(undefined1 (*) [16])(ray + 0x90));
    auVar24 = vpcmpeqd_avx(auVar24,(undefined1  [16])0x0);
    auVar24 = vpandn_avx(auVar24,(undefined1  [16])valid_i->field_0);
    uVar17 = vmovmskps_avx(auVar24);
    if (uVar17 != 0) {
      pRVar5 = context->user;
      *(undefined8 *)this = mm_lookupmask_ps._0_8_;
      *(undefined8 *)(this + 8) = uVar12;
      if (pRVar5->instID[0] == 0xffffffff) {
        pRVar5->instID[0] = uVar19;
        pRVar5->instPrimID[0] = uVar3;
        uVar14 = (ulong)prim->primID_;
        local_38 = auVar24;
        auVar13 = local_38;
        local_38._0_8_ = auVar24._0_8_;
        local_38._8_8_ = auVar24._8_8_;
        if ((pGVar16->field_8).field_0x1 == '\x01') {
          fVar23 = (pGVar16->time_range).lower;
          auVar33._4_4_ = fVar23;
          auVar33._0_4_ = fVar23;
          auVar33._8_4_ = fVar23;
          auVar33._12_4_ = fVar23;
          fVar65 = pGVar16->fnumTimeSegments;
          auVar86 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar33);
          fVar23 = (pGVar16->time_range).upper - fVar23;
          auVar34._4_4_ = fVar23;
          auVar34._0_4_ = fVar23;
          auVar34._8_4_ = fVar23;
          auVar34._12_4_ = fVar23;
          auVar33 = vdivps_avx(auVar86,auVar34);
          auVar35._0_4_ = fVar65 * auVar33._0_4_;
          auVar35._4_4_ = fVar65 * auVar33._4_4_;
          auVar35._8_4_ = fVar65 * auVar33._8_4_;
          auVar35._12_4_ = fVar65 * auVar33._12_4_;
          auVar33 = vroundps_avx(auVar35,1);
          fVar65 = fVar65 + -1.0;
          auVar115._4_4_ = fVar65;
          auVar115._0_4_ = fVar65;
          auVar115._8_4_ = fVar65;
          auVar115._12_4_ = fVar65;
          auVar34 = vminps_avx(auVar33,auVar115);
          auVar33 = ZEXT416(0) << 0x20;
          auVar34 = vmaxps_avx(auVar34,auVar33);
          auVar273 = vsubps_avx(auVar35,auVar34);
          local_98 = vcvtps2dq_avx(auVar34);
          uVar3 = 0;
          for (uVar19 = uVar17 & 0xff; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
            uVar3 = uVar3 + 1;
          }
          iVar4 = *(int *)(local_98 + (ulong)uVar3 * 4);
          auVar71._4_4_ = iVar4;
          auVar71._0_4_ = iVar4;
          auVar71._8_4_ = iVar4;
          auVar71._12_4_ = iVar4;
          auVar34 = vpcmpeqd_avx(local_98,auVar71);
          auVar35 = auVar24 & ~auVar34;
          fVar23 = auVar273._0_4_;
          fVar65 = auVar273._4_4_;
          fVar66 = auVar273._8_4_;
          fVar67 = auVar273._12_4_;
          if ((((auVar35 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar35 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar35 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar35[0xf]) {
            lVar6 = *(long *)&pGVar16[1].fnumTimeSegments;
            lVar20 = (long)iVar4 * 0x38;
            plVar2 = (long *)(lVar6 + lVar20);
            iVar4 = *(int *)(lVar6 + 0x20 + lVar20);
            if (iVar4 == 0x9134) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x10 + lVar21)),0x1c);
              local_98 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar21)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x14 + lVar21)),0x1c);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),0x28);
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar21)),0x28);
              auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x1c + lVar21)),0x1c);
              auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar21)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar36._8_8_ = 0;
              auVar36._0_8_ = *(ulong *)(lVar18 + 4 + lVar21);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar36,0x4c);
              local_98 = vshufps_avx(auVar33,auVar33,0x78);
              auVar72._8_8_ = 0;
              auVar72._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),auVar72,0x4c);
              auVar33 = vshufps_avx(auVar33,auVar33,0x78);
              auVar73._8_8_ = 0;
              auVar73._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
              auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar73,0x4c);
              auVar86 = vshufps_avx(auVar86,auVar86,0x78);
              auVar74._8_8_ = 0;
              auVar74._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar21);
              auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),auVar74,0x4c);
              auVar34 = vshufps_avx(auVar34,auVar34,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar37._8_8_ = 0;
              auVar37._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
              auVar33 = vinsertps_avx(auVar37,ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),0x20);
              auVar38._8_8_ = 0;
              auVar38._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar21);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar38);
              auVar35 = vshufps_avx(auVar86,auVar38,0xd8);
              auVar158._8_8_ = 0;
              auVar158._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar158);
              auVar34 = vshufps_avx(auVar86,auVar158,0xd8);
              fVar251 = *(float *)(lVar18 + 0x24 + lVar21);
              fVar267 = *(float *)(lVar18 + 0x28 + lVar21);
              fVar269 = *(float *)(lVar18 + 0x2c + lVar21);
              fVar271 = *(float *)(lVar18 + 0x30 + lVar21);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar251));
              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
              auVar289 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar271),ZEXT416((uint)fVar271));
              auVar86 = vrsqrtss_avx(auVar289,auVar289);
              fVar154 = auVar86._0_4_;
              fVar154 = fVar154 * 1.5 + fVar154 * fVar154 * fVar154 * auVar289._0_4_ * -0.5;
              auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar154 * fVar251)),0x30);
              local_98 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar154 * fVar267)),0x30);
              auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),0x10);
              auVar86 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar154 * fVar271)),0x30);
              auVar33 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar21)),0x20);
              auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar154 * fVar269)),0x30);
            }
            else if (iVar4 == 0x9244) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              local_98 = *(undefined1 (*) [16])(lVar18 + lVar21);
              auVar33 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar21);
              auVar86 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar21);
              auVar34 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar21);
            }
            uVar22 = local_98._0_4_;
            auVar159._4_4_ = uVar22;
            auVar159._0_4_ = uVar22;
            auVar159._8_4_ = uVar22;
            auVar159._12_4_ = uVar22;
            auVar35 = vshufps_avx(local_98,local_98,0x55);
            auVar289 = vshufps_avx(local_98,local_98,0xaa);
            auVar115 = vshufps_avx(local_98,local_98,0xff);
            uVar22 = auVar33._0_4_;
            auVar204._4_4_ = uVar22;
            auVar204._0_4_ = uVar22;
            auVar204._8_4_ = uVar22;
            auVar204._12_4_ = uVar22;
            auVar225 = vshufps_avx(auVar33,auVar33,0x55);
            auVar353 = vshufps_avx(auVar33,auVar33,0xaa);
            auVar33 = vshufps_avx(auVar33,auVar33,0xff);
            uVar22 = auVar86._0_4_;
            auVar228._4_4_ = uVar22;
            auVar228._0_4_ = uVar22;
            auVar228._8_4_ = uVar22;
            auVar228._12_4_ = uVar22;
            auVar71 = vshufps_avx(auVar86,auVar86,0x55);
            auVar24 = vshufps_avx(auVar86,auVar86,0xaa);
            auVar86 = vshufps_avx(auVar86,auVar86,0xff);
            local_378._4_4_ = auVar34._0_4_;
            auVar87 = vshufps_avx(auVar34,auVar34,0x55);
            auVar88 = vshufps_avx(auVar34,auVar34,0xaa);
            auVar34 = vshufps_avx(auVar34,auVar34,0xff);
            iVar4 = *(int *)(lVar6 + 0x58 + lVar20);
            local_378._0_4_ = local_378._4_4_;
            fStack_370 = (float)local_378._4_4_;
            fStack_36c = (float)local_378._4_4_;
            if (iVar4 == 0x9134) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar89 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar20)),0x1c);
              auVar89 = vinsertps_avx(auVar89,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar20)),0x28);
              auVar90 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar20)),0x1c);
              auVar90 = vinsertps_avx(auVar90,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar20)),0x28);
              auVar91 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),0x1c);
              auVar91 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar20)),0x28);
              auVar148 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar20)),0x1c);
              auVar148 = vinsertps_avx(auVar148,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar20)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar39._8_8_ = 0;
              auVar39._0_8_ = *(ulong *)(lVar6 + 4 + lVar20);
              auVar89 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),auVar39,0x4c);
              auVar89 = vshufps_avx(auVar89,auVar89,0x78);
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar20);
              auVar90 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),auVar40,0x4c);
              auVar90 = vshufps_avx(auVar90,auVar90,0x78);
              auVar41._8_8_ = 0;
              auVar41._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar20);
              auVar91 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),auVar41,0x4c);
              auVar91 = vshufps_avx(auVar91,auVar91,0x78);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar20);
              auVar148 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar20)),auVar42,0x4c);
              auVar148 = vshufps_avx(auVar148,auVar148,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar20);
              auVar90 = vinsertps_avx(auVar43,ZEXT416(*(uint *)(lVar6 + 8 + lVar20)),0x20);
              auVar75._8_8_ = 0;
              auVar75._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar20);
              auVar89 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),auVar75);
              auVar91 = vshufps_avx(auVar89,auVar75,0xd8);
              auVar160._8_8_ = 0;
              auVar160._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar20);
              auVar89 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),auVar160);
              auVar148 = vshufps_avx(auVar89,auVar160,0xd8);
              fVar251 = *(float *)(lVar6 + 0x24 + lVar20);
              fVar267 = *(float *)(lVar6 + 0x28 + lVar20);
              fVar269 = *(float *)(lVar6 + 0x2c + lVar20);
              fVar271 = *(float *)(lVar6 + 0x30 + lVar20);
              auVar89 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),ZEXT416((uint)fVar251),
                                        ZEXT416((uint)fVar251));
              auVar89 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
              auVar215 = vfmadd231ss_fma(auVar89,ZEXT416((uint)fVar271),ZEXT416((uint)fVar271));
              auVar89 = vrsqrtss_avx(auVar215,auVar215);
              fVar154 = auVar89._0_4_;
              fVar154 = fVar154 * 1.5 + fVar154 * fVar154 * fVar154 * auVar215._0_4_ * -0.5;
              auVar148 = vinsertps_avx(auVar148,ZEXT416((uint)(fVar154 * fVar251)),0x30);
              auVar89 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar154 * fVar267)),0x30);
              auVar215 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar20)),0x10);
              auVar91 = vinsertps_avx(auVar90,ZEXT416((uint)(fVar271 * fVar154)),0x30);
              auVar90 = vinsertps_avx(auVar215,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar20)),0x20);
              auVar90 = vinsertps_avx(auVar90,ZEXT416((uint)(fVar154 * fVar269)),0x30);
            }
            else {
              auVar90 = auVar228;
              auVar89 = auVar24;
              auVar91 = auVar204;
              auVar148 = auVar159;
              if (iVar4 == 0x9244) {
                lVar6 = plVar2[7];
                lVar20 = uVar14 * plVar2[9];
                auVar89 = *(undefined1 (*) [16])(lVar6 + lVar20);
                auVar90 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar20);
                auVar91 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar20);
                auVar148 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar20);
              }
            }
            auVar335 = vshufps_avx(auVar89,auVar89,0xff);
            auVar282 = vshufps_avx(auVar148,auVar148,0xff);
            auVar92 = vshufps_avx(auVar90,auVar90,0xff);
            auVar93 = vshufps_avx(auVar91,auVar91,0xff);
            auVar116._0_4_ =
                 auVar86._0_4_ * auVar93._0_4_ +
                 auVar33._0_4_ * auVar92._0_4_ +
                 auVar115._0_4_ * auVar335._0_4_ + auVar34._0_4_ * auVar282._0_4_;
            auVar116._4_4_ =
                 auVar86._4_4_ * auVar93._4_4_ +
                 auVar33._4_4_ * auVar92._4_4_ +
                 auVar115._4_4_ * auVar335._4_4_ + auVar34._4_4_ * auVar282._4_4_;
            auVar116._8_4_ =
                 auVar86._8_4_ * auVar93._8_4_ +
                 auVar33._8_4_ * auVar92._8_4_ +
                 auVar115._8_4_ * auVar335._8_4_ + auVar34._8_4_ * auVar282._8_4_;
            auVar116._12_4_ =
                 auVar86._12_4_ * auVar93._12_4_ +
                 auVar33._12_4_ * auVar92._12_4_ +
                 auVar115._12_4_ * auVar335._12_4_ + auVar34._12_4_ * auVar282._12_4_;
            uVar14 = CONCAT44(auVar116._4_4_,auVar116._0_4_);
            auVar205._0_8_ = uVar14 ^ 0x8000000080000000;
            auVar205._8_4_ = -auVar116._8_4_;
            auVar205._12_4_ = -auVar116._12_4_;
            auVar215 = vcmpps_avx(auVar116,auVar205,1);
            auVar255._0_8_ = auVar282._0_8_ ^ 0x8000000080000000;
            auVar255._8_4_ = -auVar282._8_4_;
            auVar255._12_4_ = -auVar282._12_4_;
            auVar282 = vblendvps_avx(auVar282,auVar255,auVar215);
            auVar256._0_8_ = auVar335._0_8_ ^ 0x8000000080000000;
            auVar256._8_4_ = -auVar335._8_4_;
            auVar256._12_4_ = -auVar335._12_4_;
            auVar335 = vblendvps_avx(auVar335,auVar256,auVar215);
            auVar44._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar44._8_4_ = -auVar92._8_4_;
            auVar44._12_4_ = -auVar92._12_4_;
            auVar92 = vblendvps_avx(auVar92,auVar44,auVar215);
            auVar45._0_8_ = auVar93._0_8_ ^ 0x8000000080000000;
            auVar45._8_4_ = -auVar93._8_4_;
            auVar45._12_4_ = -auVar93._12_4_;
            auVar93 = vblendvps_avx(auVar93,auVar45,auVar215);
            auVar97 = vmaxps_avx(auVar205,auVar116);
            auVar46._8_4_ = 0x7fffffff;
            auVar46._0_8_ = 0x7fffffff7fffffff;
            auVar46._12_4_ = 0x7fffffff;
            auVar215 = vandps_avx(auVar116,auVar46);
            fVar251 = auVar215._0_4_;
            fVar267 = auVar215._4_4_;
            fVar269 = auVar215._8_4_;
            fVar271 = auVar215._12_4_;
            auVar76._8_4_ = 0x3f800000;
            auVar76._0_8_ = &DAT_3f8000003f800000;
            auVar76._12_4_ = 0x3f800000;
            auVar94 = vsubps_avx(auVar76,auVar215);
            auVar94 = vsqrtps_avx(auVar94);
            auVar117._0_4_ =
                 auVar94._0_4_ *
                 (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._4_4_ =
                 auVar94._4_4_ *
                 (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._8_4_ =
                 auVar94._8_4_ *
                 (fVar269 * (fVar269 * (fVar269 * (fVar269 * (fVar269 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar117._12_4_ =
                 auVar94._12_4_ *
                 (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar141._8_4_ = 0x3fc90fdb;
            auVar141._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar141._12_4_ = 0x3fc90fdb;
            auVar94 = vsubps_avx(auVar141,auVar117);
            auVar343 = ZEXT816(0) << 0x40;
            auVar95 = vmaxps_avx(auVar343,auVar94);
            auVar94 = vcmpps_avx(auVar97,auVar343,1);
            auVar206._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
            auVar206._8_4_ = auVar95._8_4_ ^ 0x80000000;
            auVar206._12_4_ = auVar95._12_4_ ^ 0x80000000;
            auVar94 = vblendvps_avx(auVar95,auVar206,auVar94);
            auVar215 = vcmpps_avx(auVar215,auVar76,6);
            auVar94 = vsubps_avx(auVar141,auVar94);
            auVar161._8_4_ = 0x7fc00000;
            auVar161._0_8_ = 0x7fc000007fc00000;
            auVar161._12_4_ = 0x7fc00000;
            auVar215 = vblendvps_avx(auVar94,auVar161,auVar215);
            auVar47._0_4_ = fVar23 * auVar215._0_4_;
            auVar47._4_4_ = fVar65 * auVar215._4_4_;
            auVar47._8_4_ = fVar66 * auVar215._8_4_;
            auVar47._12_4_ = fVar67 * auVar215._12_4_;
            auVar118._0_4_ = auVar47._0_4_ * 0.63661975;
            auVar118._4_4_ = auVar47._4_4_ * 0.63661975;
            auVar118._8_4_ = auVar47._8_4_ * 0.63661975;
            auVar118._12_4_ = auVar47._12_4_ * 0.63661975;
            auVar215 = vroundps_avx(auVar118,1);
            auVar142._0_4_ = auVar215._0_4_ * 1.5707964;
            auVar142._4_4_ = auVar215._4_4_ * 1.5707964;
            auVar142._8_4_ = auVar215._8_4_ * 1.5707964;
            auVar142._12_4_ = auVar215._12_4_ * 1.5707964;
            auVar94 = vsubps_avx(auVar47,auVar142);
            fVar251 = auVar94._0_4_;
            fVar154 = fVar251 * fVar251;
            fVar267 = auVar94._4_4_;
            fVar194 = fVar267 * fVar267;
            fVar269 = auVar94._8_4_;
            fVar195 = fVar269 * fVar269;
            fVar271 = auVar94._12_4_;
            fVar196 = fVar271 * fVar271;
            auVar48._0_4_ =
                 fVar251 * ((fVar154 * (fVar154 * (fVar154 * (fVar154 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar154 + 1.0);
            auVar48._4_4_ =
                 fVar267 * ((fVar194 * (fVar194 * (fVar194 * (fVar194 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar194 + 1.0);
            auVar48._8_4_ =
                 fVar269 * ((fVar195 * (fVar195 * (fVar195 * (fVar195 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar195 + 1.0);
            auVar48._12_4_ =
                 fVar271 * ((fVar196 * (fVar196 * (fVar196 * (fVar196 * -2.5029328e-08 +
                                                             2.7600126e-06) + -0.00019842605) +
                                       0.008333348) + -0.16666667) * fVar196 + 1.0);
            auVar96 = vcvtps2dq_avx(auVar215);
            auVar207._8_4_ = 1;
            auVar207._0_8_ = 0x100000001;
            auVar207._12_4_ = 1;
            auVar215 = vandpd_avx(auVar96,auVar207);
            auVar95 = vpcmpeqd_avx(auVar215,auVar343);
            auVar215 = vpsubd_avx(auVar343,auVar215);
            auVar162._0_4_ =
                 fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar162._4_4_ =
                 fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar162._8_4_ =
                 fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar162._12_4_ =
                 fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar94 = vblendvps_avx(auVar48,auVar162,auVar215);
            auVar95 = vblendvps_avx(auVar48,auVar162,auVar95);
            auVar77._8_4_ = 3;
            auVar77._0_8_ = 0x300000003;
            auVar77._12_4_ = 3;
            auVar215 = vandpd_avx(auVar96,auVar77);
            auVar96 = vpcmpgtd_avx(auVar215,auVar207);
            auVar163._0_8_ = auVar94._0_8_ ^ 0x8000000080000000;
            auVar163._8_4_ = auVar94._8_4_ ^ 0x80000000;
            auVar163._12_4_ = auVar94._12_4_ ^ 0x80000000;
            auVar94 = vblendvps_avx(auVar94,auVar163,auVar96);
            auVar96 = vpcmpeqd_avx(auVar96,auVar96);
            auVar215 = vpaddd_avx(auVar215,auVar96);
            auVar96 = vpminud_avx(auVar215,auVar207);
            auVar215 = vpcmpeqd_avx(auVar215,auVar96);
            auVar119._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
            auVar119._8_4_ = auVar95._8_4_ ^ 0x80000000;
            auVar119._12_4_ = auVar95._12_4_ ^ 0x80000000;
            auVar215 = vblendvps_avx(auVar95,auVar119,auVar215);
            auVar95 = vfmsub213ps_fma(auVar34,auVar97,auVar282);
            auVar96 = vfmsub213ps_fma(auVar115,auVar97,auVar335);
            fVar251 = auVar95._0_4_;
            fVar194 = auVar95._4_4_;
            fVar236 = auVar95._8_4_;
            fVar8 = auVar95._12_4_;
            fVar267 = auVar96._0_4_;
            fVar195 = auVar96._4_4_;
            fVar237 = auVar96._8_4_;
            fVar9 = auVar96._12_4_;
            auVar95 = vfmsub213ps_fma(auVar33,auVar97,auVar92);
            fVar269 = auVar95._0_4_;
            fVar196 = auVar95._4_4_;
            fVar238 = auVar95._8_4_;
            fVar360 = auVar95._12_4_;
            auVar95 = vfmsub213ps_fma(auVar86,auVar97,auVar93);
            fVar271 = auVar95._0_4_;
            fVar221 = auVar95._4_4_;
            fVar7 = auVar95._8_4_;
            fVar10 = auVar95._12_4_;
            auVar120._0_4_ =
                 fVar271 * fVar271 + fVar269 * fVar269 + fVar267 * fVar267 + fVar251 * fVar251;
            auVar120._4_4_ =
                 fVar221 * fVar221 + fVar196 * fVar196 + fVar195 * fVar195 + fVar194 * fVar194;
            auVar120._8_4_ =
                 fVar7 * fVar7 + fVar238 * fVar238 + fVar237 * fVar237 + fVar236 * fVar236;
            auVar120._12_4_ = fVar10 * fVar10 + fVar360 * fVar360 + fVar9 * fVar9 + fVar8 * fVar8;
            auVar95 = vrsqrtps_avx(auVar120);
            fVar154 = auVar95._0_4_;
            fVar266 = auVar95._4_4_;
            fVar268 = auVar95._8_4_;
            fVar270 = auVar95._12_4_;
            auVar277._0_4_ = fVar154 * fVar154 * fVar154 * auVar120._0_4_ * -0.5;
            auVar277._4_4_ = fVar266 * fVar266 * fVar266 * auVar120._4_4_ * -0.5;
            auVar277._8_4_ = fVar268 * fVar268 * fVar268 * auVar120._8_4_ * -0.5;
            auVar277._12_4_ = fVar270 * fVar270 * fVar270 * auVar120._12_4_ * -0.5;
            auVar121._8_4_ = 0x3fc00000;
            auVar121._0_8_ = 0x3fc000003fc00000;
            auVar121._12_4_ = 0x3fc00000;
            auVar95 = vfmadd231ps_fma(auVar277,auVar121,auVar95);
            fVar266 = auVar95._0_4_;
            fVar268 = auVar95._4_4_;
            fVar270 = auVar95._8_4_;
            fVar288 = auVar95._12_4_;
            fVar154 = auVar94._0_4_;
            auVar331._0_4_ = fVar266 * fVar251 * fVar154;
            fVar251 = auVar94._4_4_;
            auVar331._4_4_ = fVar268 * fVar194 * fVar251;
            fVar194 = auVar94._8_4_;
            auVar331._8_4_ = fVar270 * fVar236 * fVar194;
            fVar236 = auVar94._12_4_;
            auVar331._12_4_ = fVar288 * fVar8 * fVar236;
            auVar49._0_4_ = fVar266 * fVar267 * fVar154;
            auVar49._4_4_ = fVar268 * fVar195 * fVar251;
            auVar49._8_4_ = fVar270 * fVar237 * fVar194;
            auVar49._12_4_ = fVar288 * fVar9 * fVar236;
            auVar350._0_4_ = fVar269 * fVar266 * fVar154;
            auVar350._4_4_ = fVar196 * fVar268 * fVar251;
            auVar350._8_4_ = fVar238 * fVar270 * fVar194;
            auVar350._12_4_ = fVar360 * fVar288 * fVar236;
            auVar164._0_4_ = fVar271 * fVar266 * fVar154;
            auVar164._4_4_ = fVar221 * fVar268 * fVar251;
            auVar164._8_4_ = fVar7 * fVar270 * fVar194;
            auVar164._12_4_ = fVar10 * fVar288 * fVar236;
            auVar94 = vfmsub231ps_fma(auVar331,auVar215,auVar34);
            auVar95 = vfmsub231ps_fma(auVar49,auVar215,auVar115);
            auVar96 = vfmsub231ps_fma(auVar350,auVar215,auVar33);
            auVar98 = vfmsub231ps_fma(auVar164,auVar86,auVar215);
            auVar215 = vsubps_avx(auVar282,auVar34);
            auVar215 = vfmadd213ps_fma(auVar215,auVar273,auVar34);
            auVar34 = vsubps_avx(auVar335,auVar115);
            auVar115 = vfmadd213ps_fma(auVar34,auVar273,auVar115);
            auVar34 = vsubps_avx(auVar92,auVar33);
            auVar34 = vfmadd213ps_fma(auVar34,auVar273,auVar33);
            auVar33 = vsubps_avx(auVar93,auVar86);
            auVar33 = vfmadd213ps_fma(auVar33,auVar273,auVar86);
            fVar251 = auVar215._0_4_;
            fVar194 = auVar215._4_4_;
            fVar236 = auVar215._8_4_;
            fVar8 = auVar215._12_4_;
            fVar267 = auVar115._0_4_;
            fVar195 = auVar115._4_4_;
            fVar237 = auVar115._8_4_;
            fVar9 = auVar115._12_4_;
            fVar269 = auVar34._0_4_;
            fVar196 = auVar34._4_4_;
            fVar238 = auVar34._8_4_;
            fVar360 = auVar34._12_4_;
            fVar271 = auVar33._0_4_;
            fVar221 = auVar33._4_4_;
            fVar7 = auVar33._8_4_;
            fVar10 = auVar33._12_4_;
            auVar278._0_4_ =
                 fVar271 * fVar271 + fVar269 * fVar269 + fVar251 * fVar251 + fVar267 * fVar267;
            auVar278._4_4_ =
                 fVar221 * fVar221 + fVar196 * fVar196 + fVar194 * fVar194 + fVar195 * fVar195;
            auVar278._8_4_ =
                 fVar7 * fVar7 + fVar238 * fVar238 + fVar236 * fVar236 + fVar237 * fVar237;
            auVar278._12_4_ = fVar10 * fVar10 + fVar360 * fVar360 + fVar8 * fVar8 + fVar9 * fVar9;
            auVar33 = vrsqrtps_avx(auVar278);
            fVar154 = auVar33._0_4_;
            fVar266 = auVar33._4_4_;
            fVar268 = auVar33._8_4_;
            fVar270 = auVar33._12_4_;
            auVar143._0_4_ = fVar154 * fVar154 * fVar154 * auVar278._0_4_ * -0.5;
            auVar143._4_4_ = fVar266 * fVar266 * fVar266 * auVar278._4_4_ * -0.5;
            auVar143._8_4_ = fVar268 * fVar268 * fVar268 * auVar278._8_4_ * -0.5;
            auVar143._12_4_ = fVar270 * fVar270 * fVar270 * auVar278._12_4_ * -0.5;
            auVar33 = vfmadd231ps_fma(auVar143,auVar33,auVar121);
            fVar154 = auVar33._0_4_;
            auVar78._0_4_ = fVar251 * fVar154;
            fVar251 = auVar33._4_4_;
            auVar78._4_4_ = fVar194 * fVar251;
            fVar194 = auVar33._8_4_;
            auVar78._8_4_ = fVar236 * fVar194;
            fVar236 = auVar33._12_4_;
            auVar78._12_4_ = fVar8 * fVar236;
            auVar122._0_4_ = fVar267 * fVar154;
            auVar122._4_4_ = fVar195 * fVar251;
            auVar122._8_4_ = fVar237 * fVar194;
            auVar122._12_4_ = fVar9 * fVar236;
            auVar208._0_4_ = fVar269 * fVar154;
            auVar208._4_4_ = fVar196 * fVar251;
            auVar208._8_4_ = fVar238 * fVar194;
            auVar208._12_4_ = fVar360 * fVar236;
            auVar240._0_4_ = fVar271 * fVar154;
            auVar240._4_4_ = fVar221 * fVar251;
            auVar240._8_4_ = fVar7 * fVar194;
            auVar240._12_4_ = fVar10 * fVar236;
            auVar144._8_4_ = 0x3f7fdf3b;
            auVar144._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar144._12_4_ = 0x3f7fdf3b;
            auVar115 = vcmpps_avx(auVar97,auVar144,6);
            auVar33 = vblendvps_avx(auVar94,auVar78,auVar115);
            auVar86 = vblendvps_avx(auVar95,auVar122,auVar115);
            auVar34 = vblendvps_avx(auVar96,auVar208,auVar115);
            auVar115 = vblendvps_avx(auVar98,auVar240,auVar115);
            auVar123._8_4_ = 0x3f800000;
            auVar123._0_8_ = &DAT_3f8000003f800000;
            auVar123._12_4_ = 0x3f800000;
            auVar215 = vsubps_avx(auVar123,auVar273);
            fVar251 = auVar89._0_4_;
            auVar165._0_4_ = fVar23 * fVar251;
            auVar165._4_4_ = fVar65 * fVar251;
            auVar165._8_4_ = fVar66 * fVar251;
            auVar165._12_4_ = fVar67 * fVar251;
            auVar282 = vfmadd213ps_fma(auVar159,auVar215,auVar165);
            auVar273 = vshufps_avx(auVar89,auVar89,0x55);
            auVar166._0_4_ = fVar23 * auVar273._0_4_;
            auVar166._4_4_ = fVar65 * auVar273._4_4_;
            auVar166._8_4_ = fVar66 * auVar273._8_4_;
            auVar166._12_4_ = fVar67 * auVar273._12_4_;
            auVar335 = vfmadd213ps_fma(auVar35,auVar215,auVar166);
            auVar273 = vshufps_avx(auVar89,auVar89,0xaa);
            auVar167._0_4_ = fVar23 * auVar273._0_4_;
            auVar167._4_4_ = fVar65 * auVar273._4_4_;
            auVar167._8_4_ = fVar66 * auVar273._8_4_;
            auVar167._12_4_ = fVar67 * auVar273._12_4_;
            auVar89 = vfmadd213ps_fma(auVar289,auVar215,auVar167);
            fVar251 = auVar90._0_4_;
            auVar168._0_4_ = fVar23 * fVar251;
            auVar168._4_4_ = fVar65 * fVar251;
            auVar168._8_4_ = fVar66 * fVar251;
            auVar168._12_4_ = fVar67 * fVar251;
            auVar92 = vfmadd213ps_fma(auVar204,auVar215,auVar168);
            auVar273 = vshufps_avx(auVar90,auVar90,0x55);
            auVar169._0_4_ = fVar23 * auVar273._0_4_;
            auVar169._4_4_ = fVar65 * auVar273._4_4_;
            auVar169._8_4_ = fVar66 * auVar273._8_4_;
            auVar169._12_4_ = fVar67 * auVar273._12_4_;
            auVar225 = vfmadd213ps_fma(auVar225,auVar215,auVar169);
            auVar273 = vshufps_avx(auVar90,auVar90,0xaa);
            auVar170._0_4_ = fVar23 * auVar273._0_4_;
            auVar170._4_4_ = fVar65 * auVar273._4_4_;
            auVar170._8_4_ = fVar66 * auVar273._8_4_;
            auVar170._12_4_ = fVar67 * auVar273._12_4_;
            auVar353 = vfmadd213ps_fma(auVar353,auVar215,auVar170);
            fVar251 = auVar91._0_4_;
            auVar171._0_4_ = fVar23 * fVar251;
            auVar171._4_4_ = fVar65 * fVar251;
            auVar171._8_4_ = fVar66 * fVar251;
            auVar171._12_4_ = fVar67 * fVar251;
            auVar90 = vfmadd213ps_fma(auVar228,auVar215,auVar171);
            auVar273 = vshufps_avx(auVar91,auVar91,0x55);
            auVar172._0_4_ = fVar23 * auVar273._0_4_;
            auVar172._4_4_ = fVar65 * auVar273._4_4_;
            auVar172._8_4_ = fVar66 * auVar273._8_4_;
            auVar172._12_4_ = fVar67 * auVar273._12_4_;
            auVar71 = vfmadd213ps_fma(auVar71,auVar215,auVar172);
            auVar273 = vshufps_avx(auVar91,auVar91,0xaa);
            auVar173._0_4_ = fVar23 * auVar273._0_4_;
            auVar173._4_4_ = fVar65 * auVar273._4_4_;
            auVar173._8_4_ = fVar66 * auVar273._8_4_;
            auVar173._12_4_ = fVar67 * auVar273._12_4_;
            auVar24 = vfmadd213ps_fma(auVar24,auVar215,auVar173);
            fVar251 = auVar148._0_4_;
            auVar273 = vshufps_avx(auVar148,auVar148,0x55);
            auVar35 = vshufps_avx(auVar148,auVar148,0xaa);
            auVar174._0_4_ = fVar23 * fVar251;
            auVar174._4_4_ = fVar65 * fVar251;
            auVar174._8_4_ = fVar66 * fVar251;
            auVar174._12_4_ = fVar67 * fVar251;
            auVar209._0_4_ = fVar23 * auVar273._0_4_;
            auVar209._4_4_ = fVar65 * auVar273._4_4_;
            auVar209._8_4_ = fVar66 * auVar273._8_4_;
            auVar209._12_4_ = fVar67 * auVar273._12_4_;
            auVar241._0_4_ = fVar23 * auVar35._0_4_;
            auVar241._4_4_ = fVar65 * auVar35._4_4_;
            auVar241._8_4_ = fVar66 * auVar35._8_4_;
            auVar241._12_4_ = fVar67 * auVar35._12_4_;
            auVar91 = vfmadd213ps_fma(_local_378,auVar215,auVar174);
            auVar87 = vfmadd213ps_fma(auVar87,auVar215,auVar209);
            auVar88 = vfmadd213ps_fma(auVar88,auVar215,auVar241);
            fVar23 = auVar34._0_4_;
            fVar221 = auVar86._0_4_;
            auVar124._0_4_ = fVar221 * fVar23;
            fVar66 = auVar34._4_4_;
            fVar236 = auVar86._4_4_;
            auVar124._4_4_ = fVar236 * fVar66;
            fVar251 = auVar34._8_4_;
            fVar237 = auVar86._8_4_;
            auVar124._8_4_ = fVar237 * fVar251;
            fVar269 = auVar34._12_4_;
            fVar238 = auVar86._12_4_;
            auVar124._12_4_ = fVar238 * fVar269;
            fVar65 = auVar115._0_4_;
            fVar154 = auVar33._0_4_;
            auVar210._0_4_ = fVar154 * fVar65;
            fVar67 = auVar115._4_4_;
            fVar194 = auVar33._4_4_;
            auVar210._4_4_ = fVar194 * fVar67;
            fVar267 = auVar115._8_4_;
            fVar195 = auVar33._8_4_;
            auVar210._8_4_ = fVar195 * fVar267;
            fVar271 = auVar115._12_4_;
            fVar196 = auVar33._12_4_;
            auVar210._12_4_ = fVar196 * fVar271;
            auVar33 = vsubps_avx(auVar124,auVar210);
            auVar211._0_4_ = fVar154 * fVar154;
            auVar211._4_4_ = fVar194 * fVar194;
            auVar211._8_4_ = fVar195 * fVar195;
            auVar211._12_4_ = fVar196 * fVar196;
            auVar242._0_4_ = fVar221 * fVar221;
            auVar242._4_4_ = fVar236 * fVar236;
            auVar242._8_4_ = fVar237 * fVar237;
            auVar242._12_4_ = fVar238 * fVar238;
            auVar257._0_4_ = auVar211._0_4_ + auVar242._0_4_;
            auVar257._4_4_ = auVar211._4_4_ + auVar242._4_4_;
            auVar257._8_4_ = auVar211._8_4_ + auVar242._8_4_;
            auVar257._12_4_ = auVar211._12_4_ + auVar242._12_4_;
            auVar86 = vsubps_avx(auVar211,auVar242);
            auVar243._0_4_ = fVar221 * fVar65;
            auVar243._4_4_ = fVar236 * fVar67;
            auVar243._8_4_ = fVar237 * fVar267;
            auVar243._12_4_ = fVar238 * fVar271;
            auVar229._0_4_ = fVar154 * fVar221;
            auVar229._4_4_ = fVar194 * fVar236;
            auVar229._8_4_ = fVar195 * fVar237;
            auVar229._12_4_ = fVar196 * fVar238;
            auVar145._0_4_ = fVar154 * fVar23;
            auVar145._4_4_ = fVar194 * fVar66;
            auVar145._8_4_ = fVar195 * fVar251;
            auVar145._12_4_ = fVar196 * fVar269;
            auVar34 = vsubps_avx(auVar243,auVar145);
            auVar244._0_4_ = fVar23 * fVar65;
            auVar244._4_4_ = fVar66 * fVar67;
            auVar244._8_4_ = fVar251 * fVar267;
            auVar244._12_4_ = fVar269 * fVar271;
            auVar273 = vsubps_avx(auVar244,auVar229);
            auVar79._0_4_ = fVar23 * fVar23;
            auVar79._4_4_ = fVar66 * fVar66;
            auVar79._8_4_ = fVar251 * fVar251;
            auVar79._12_4_ = fVar269 * fVar269;
            auVar35 = vsubps_avx(auVar257,auVar79);
            auVar258._0_4_ = auVar79._0_4_ + auVar86._0_4_;
            auVar258._4_4_ = auVar79._4_4_ + auVar86._4_4_;
            auVar258._8_4_ = auVar79._8_4_ + auVar86._8_4_;
            auVar258._12_4_ = auVar79._12_4_ + auVar86._12_4_;
            auVar86 = vsubps_avx(auVar86,auVar79);
            auVar50._0_4_ = fVar65 * fVar65;
            auVar50._4_4_ = fVar67 * fVar67;
            auVar50._8_4_ = fVar267 * fVar267;
            auVar50._12_4_ = fVar271 * fVar271;
            auVar35 = vsubps_avx(auVar35,auVar50);
            auVar289 = vsubps_avx(auVar258,auVar50);
            auVar51._0_4_ = auVar50._0_4_ + auVar86._0_4_;
            auVar51._4_4_ = auVar50._4_4_ + auVar86._4_4_;
            auVar51._8_4_ = auVar50._8_4_ + auVar86._8_4_;
            auVar51._12_4_ = auVar50._12_4_ + auVar86._12_4_;
            auVar332._0_4_ = auVar124._0_4_ + auVar210._0_4_ + auVar124._0_4_ + auVar210._0_4_;
            auVar332._4_4_ = auVar124._4_4_ + auVar210._4_4_ + auVar124._4_4_ + auVar210._4_4_;
            auVar332._8_4_ = auVar124._8_4_ + auVar210._8_4_ + auVar124._8_4_ + auVar210._8_4_;
            auVar332._12_4_ = auVar124._12_4_ + auVar210._12_4_ + auVar124._12_4_ + auVar210._12_4_;
            auVar80._0_4_ = auVar34._0_4_ + auVar34._0_4_;
            auVar80._4_4_ = auVar34._4_4_ + auVar34._4_4_;
            auVar80._8_4_ = auVar34._8_4_ + auVar34._8_4_;
            auVar80._12_4_ = auVar34._12_4_ + auVar34._12_4_;
            auVar245._0_4_ = auVar80._0_4_ * 0.0;
            auVar245._4_4_ = auVar80._4_4_ * 0.0;
            auVar245._8_4_ = auVar80._8_4_ * 0.0;
            auVar245._12_4_ = auVar80._12_4_ * 0.0;
            auVar86 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar332,auVar245);
            auVar175._0_4_ = auVar332._0_4_ + auVar245._0_4_;
            auVar175._4_4_ = auVar332._4_4_ + auVar245._4_4_;
            auVar175._8_4_ = auVar332._8_4_ + auVar245._8_4_;
            auVar175._12_4_ = auVar332._12_4_ + auVar245._12_4_;
            auVar34 = vfmadd213ps_fma(auVar332,auVar343,auVar80);
            auVar81._0_4_ = auVar244._0_4_ + auVar229._0_4_ + auVar244._0_4_ + auVar229._0_4_;
            auVar81._4_4_ = auVar244._4_4_ + auVar229._4_4_ + auVar244._4_4_ + auVar229._4_4_;
            auVar81._8_4_ = auVar244._8_4_ + auVar229._8_4_ + auVar244._8_4_ + auVar229._8_4_;
            auVar81._12_4_ = auVar244._12_4_ + auVar229._12_4_ + auVar244._12_4_ + auVar229._12_4_;
            auVar246._0_4_ = auVar81._0_4_ * 0.0;
            auVar246._4_4_ = auVar81._4_4_ * 0.0;
            auVar246._8_4_ = auVar81._8_4_ * 0.0;
            auVar246._12_4_ = auVar81._12_4_ * 0.0;
            auVar115 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar289,auVar246);
            auVar279._0_4_ = auVar289._0_4_ + auVar246._0_4_;
            auVar279._4_4_ = auVar289._4_4_ + auVar246._4_4_;
            auVar279._8_4_ = auVar289._8_4_ + auVar246._8_4_;
            auVar279._12_4_ = auVar289._12_4_ + auVar246._12_4_;
            auVar289 = vfmadd213ps_fma(auVar289,auVar343,auVar81);
            auVar82._0_4_ = auVar33._0_4_ + auVar33._0_4_;
            auVar82._4_4_ = auVar33._4_4_ + auVar33._4_4_;
            auVar82._8_4_ = auVar33._8_4_ + auVar33._8_4_;
            auVar82._12_4_ = auVar33._12_4_ + auVar33._12_4_;
            auVar292._0_4_ = auVar115._0_4_ + auVar82._0_4_;
            auVar292._4_4_ = auVar115._4_4_ + auVar82._4_4_;
            auVar292._8_4_ = auVar115._8_4_ + auVar82._8_4_;
            auVar292._12_4_ = auVar115._12_4_ + auVar82._12_4_;
            auVar115 = vfmadd231ps_fma(auVar279,auVar82,auVar343);
            auVar148 = vfmadd231ps_fma(auVar289,auVar343,auVar82);
            auVar125._0_4_ = auVar273._0_4_ + auVar273._0_4_;
            auVar125._4_4_ = auVar273._4_4_ + auVar273._4_4_;
            auVar125._8_4_ = auVar273._8_4_ + auVar273._8_4_;
            auVar125._12_4_ = auVar273._12_4_ + auVar273._12_4_;
            auVar83._0_4_ = auVar51._0_4_ * 0.0;
            auVar83._4_4_ = auVar51._4_4_ * 0.0;
            auVar83._8_4_ = auVar51._8_4_ * 0.0;
            auVar83._12_4_ = auVar51._12_4_ * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar125,auVar83);
            auVar84._0_4_ = auVar125._0_4_ + auVar83._0_4_;
            auVar84._4_4_ = auVar125._4_4_ + auVar83._4_4_;
            auVar84._8_4_ = auVar125._8_4_ + auVar83._8_4_;
            auVar84._12_4_ = auVar125._12_4_ + auVar83._12_4_;
            auVar273 = vfmadd213ps_fma(auVar125,auVar343,auVar51);
            auVar52._0_4_ = auVar243._0_4_ + auVar145._0_4_ + auVar243._0_4_ + auVar145._0_4_;
            auVar52._4_4_ = auVar243._4_4_ + auVar145._4_4_ + auVar243._4_4_ + auVar145._4_4_;
            auVar52._8_4_ = auVar243._8_4_ + auVar145._8_4_ + auVar243._8_4_ + auVar145._8_4_;
            auVar52._12_4_ = auVar243._12_4_ + auVar145._12_4_ + auVar243._12_4_ + auVar145._12_4_;
            fVar251 = auVar52._0_4_ + auVar33._0_4_;
            fVar267 = auVar52._4_4_ + auVar33._4_4_;
            fVar269 = auVar52._8_4_ + auVar33._8_4_;
            fVar271 = auVar52._12_4_ + auVar33._12_4_;
            auVar289 = vfmadd231ps_fma(auVar84,auVar52,auVar343);
            auVar273 = vfmadd231ps_fma(auVar273,auVar343,auVar52);
            auVar215 = vfmadd231ps_fma(auVar175,auVar35,auVar343);
            auVar93 = vfmadd231ps_fma(auVar34,auVar343,auVar35);
            local_308._0_4_ = auVar89._0_4_;
            local_308._4_4_ = auVar89._4_4_;
            fStack_300 = auVar89._8_4_;
            fStack_2fc = auVar89._12_4_;
            auVar307._0_4_ = fVar251 * 0.0;
            auVar307._4_4_ = fVar267 * 0.0;
            auVar307._8_4_ = fVar269 * 0.0;
            auVar307._12_4_ = fVar271 * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar292,auVar307);
            fVar154 = auVar289._0_4_;
            auVar259._0_4_ = fVar154 * 0.0;
            fVar194 = auVar289._4_4_;
            auVar259._4_4_ = fVar194 * 0.0;
            fVar195 = auVar289._8_4_;
            auVar259._8_4_ = fVar195 * 0.0;
            fVar196 = auVar289._12_4_;
            auVar259._12_4_ = fVar196 * 0.0;
            auVar34 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar115,auVar259);
            fVar23 = auVar273._0_4_;
            auVar53._0_4_ = fVar23 * 0.0;
            fVar65 = auVar273._4_4_;
            auVar53._4_4_ = fVar65 * 0.0;
            fVar66 = auVar273._8_4_;
            auVar53._8_4_ = fVar66 * 0.0;
            fVar67 = auVar273._12_4_;
            auVar53._12_4_ = fVar67 * 0.0;
            auVar273 = vfmadd213ps_fma(auVar343,auVar148,auVar53);
            auVar89 = vfmadd231ps_fma(auVar307,auVar225,auVar292);
            auVar94 = vfmadd231ps_fma(auVar259,auVar225,auVar115);
            auVar289 = vfmadd213ps_fma(auVar225,auVar148,auVar53);
            local_348._0_4_ = auVar24._0_4_;
            local_348._4_4_ = auVar24._4_4_;
            uStack_340._0_4_ = auVar24._8_4_;
            uStack_340._4_4_ = auVar24._12_4_;
            auVar176._0_4_ = (float)local_348._0_4_ * fVar251;
            auVar176._4_4_ = (float)local_348._4_4_ * fVar267;
            auVar176._8_4_ = (float)uStack_340 * fVar269;
            auVar176._12_4_ = uStack_340._4_4_ * fVar271;
            auVar146._0_4_ = fVar154 * (float)local_348._0_4_;
            auVar146._4_4_ = fVar194 * (float)local_348._4_4_;
            auVar146._8_4_ = fVar195 * (float)uStack_340;
            auVar146._12_4_ = fVar196 * uStack_340._4_4_;
            auVar85._0_4_ = (float)local_348._0_4_ * fVar23;
            auVar85._4_4_ = (float)local_348._4_4_ * fVar65;
            auVar85._8_4_ = (float)uStack_340 * fVar66;
            auVar85._12_4_ = uStack_340._4_4_ * fVar67;
            auVar225 = vfmadd231ps_fma(auVar176,auVar71,auVar292);
            auVar24 = vfmadd231ps_fma(auVar146,auVar71,auVar115);
            auVar71 = vfmadd231ps_fma(auVar85,auVar148,auVar71);
            local_2f8._0_4_ = auVar88._0_4_;
            local_2f8._4_4_ = auVar88._4_4_;
            uStack_2f0._0_4_ = auVar88._8_4_;
            uStack_2f0._4_4_ = auVar88._12_4_;
            auVar356._0_4_ = (float)local_2f8._0_4_ * fVar251;
            auVar356._4_4_ = (float)local_2f8._4_4_ * fVar267;
            auVar356._8_4_ = (float)uStack_2f0 * fVar269;
            auVar356._12_4_ = uStack_2f0._4_4_ * fVar271;
            auVar293._0_4_ = (float)local_2f8._0_4_ * fVar154;
            auVar293._4_4_ = (float)local_2f8._4_4_ * fVar194;
            auVar293._8_4_ = (float)uStack_2f0 * fVar195;
            auVar293._12_4_ = uStack_2f0._4_4_ * fVar196;
            auVar126._0_4_ = (float)local_2f8._0_4_ * fVar23;
            auVar126._4_4_ = (float)local_2f8._4_4_ * fVar65;
            auVar126._8_4_ = (float)uStack_2f0 * fVar66;
            auVar126._12_4_ = uStack_2f0._4_4_ * fVar67;
            auVar88 = vfmadd231ps_fma(auVar356,auVar87,auVar292);
            auVar115 = vfmadd231ps_fma(auVar293,auVar87,auVar115);
            auVar87 = vfmadd231ps_fma(auVar126,auVar87,auVar148);
            local_298._0_4_ = auVar35._0_4_;
            local_298._4_4_ = auVar35._4_4_;
            fStack_290 = auVar35._8_4_;
            fStack_28c = auVar35._12_4_;
            local_2d8._0_4_ = auVar86._0_4_;
            local_2d8._4_4_ = auVar86._4_4_;
            fStack_2d0 = auVar86._8_4_;
            fStack_2cc = auVar86._12_4_;
            auVar212._0_4_ = (float)local_298._0_4_ + (float)local_2d8._0_4_;
            auVar212._4_4_ = (float)local_298._4_4_ + (float)local_2d8._4_4_;
            auVar212._8_4_ = fStack_290 + fStack_2d0;
            auVar212._12_4_ = fStack_28c + fStack_2cc;
            auVar33 = vfmadd231ps_fma(auVar33,auVar282,auVar212);
            auVar86 = vfmadd231ps_fma(auVar34,auVar282,auVar215);
            auVar34 = vfmadd231ps_fma(auVar273,auVar93,auVar282);
            auVar273 = vfmadd231ps_fma(auVar89,auVar92,auVar212);
            auVar35 = vfmadd231ps_fma(auVar94,auVar92,auVar215);
            auVar289 = vfmadd231ps_fma(auVar289,auVar93,auVar92);
            auVar225 = vfmadd231ps_fma(auVar225,auVar90,auVar212);
            auVar24 = vfmadd231ps_fma(auVar24,auVar90,auVar215);
            auVar71 = vfmadd231ps_fma(auVar71,auVar93,auVar90);
            auVar88 = vfmadd231ps_fma(auVar88,auVar91,auVar212);
            local_388._4_4_ = auVar88._4_4_ + auVar335._4_4_ + 0.0;
            local_388._0_4_ = auVar88._0_4_ + auVar335._0_4_ + 0.0;
            fStack_380 = auVar88._8_4_ + auVar335._8_4_ + 0.0;
            fStack_37c = auVar88._12_4_ + auVar335._12_4_ + 0.0;
            auVar115 = vfmadd231ps_fma(auVar115,auVar91,auVar215);
            auVar357._0_4_ = auVar115._0_4_ + (float)local_308._0_4_ + 0.0;
            auVar357._4_4_ = auVar115._4_4_ + (float)local_308._4_4_ + 0.0;
            auVar357._8_4_ = auVar115._8_4_ + fStack_300 + 0.0;
            auVar357._12_4_ = auVar115._12_4_ + fStack_2fc + 0.0;
            auVar115 = vfmadd231ps_fma(auVar87,auVar91,auVar93);
            fVar23 = auVar115._0_4_ + auVar353._0_4_ + 0.0;
            fVar65 = auVar115._4_4_ + auVar353._4_4_ + 0.0;
            fVar66 = auVar115._8_4_ + auVar353._8_4_ + 0.0;
            fVar67 = auVar115._12_4_ + auVar353._12_4_ + 0.0;
            auVar127._0_4_ = auVar24._0_4_ * auVar289._0_4_;
            auVar127._4_4_ = auVar24._4_4_ * auVar289._4_4_;
            auVar127._8_4_ = auVar24._8_4_ * auVar289._8_4_;
            auVar127._12_4_ = auVar24._12_4_ * auVar289._12_4_;
            auVar115 = vfmsub231ps_fma(auVar127,auVar35,auVar71);
            auVar333._0_4_ = auVar273._0_4_ * auVar71._0_4_;
            auVar333._4_4_ = auVar273._4_4_ * auVar71._4_4_;
            auVar333._8_4_ = auVar273._8_4_ * auVar71._8_4_;
            auVar333._12_4_ = auVar273._12_4_ * auVar71._12_4_;
            auVar353 = vfmsub231ps_fma(auVar333,auVar289,auVar225);
            auVar294._0_4_ = auVar35._0_4_ * auVar225._0_4_;
            auVar294._4_4_ = auVar35._4_4_ * auVar225._4_4_;
            auVar294._8_4_ = auVar35._8_4_ * auVar225._8_4_;
            auVar294._12_4_ = auVar35._12_4_ * auVar225._12_4_;
            auVar87 = vfmsub231ps_fma(auVar294,auVar273,auVar24);
            fVar251 = auVar34._0_4_;
            auVar213._0_4_ = fVar251 * auVar225._0_4_;
            fVar267 = auVar34._4_4_;
            auVar213._4_4_ = fVar267 * auVar225._4_4_;
            fVar269 = auVar34._8_4_;
            auVar213._8_4_ = fVar269 * auVar225._8_4_;
            fVar271 = auVar34._12_4_;
            auVar213._12_4_ = fVar271 * auVar225._12_4_;
            auVar88 = vfmsub231ps_fma(auVar213,auVar33,auVar71);
            auVar214._0_4_ = auVar86._0_4_ * auVar71._0_4_;
            auVar214._4_4_ = auVar86._4_4_ * auVar71._4_4_;
            auVar214._8_4_ = auVar86._8_4_ * auVar71._8_4_;
            auVar214._12_4_ = auVar86._12_4_ * auVar71._12_4_;
            auVar71 = vfmsub231ps_fma(auVar214,auVar24,auVar34);
            auVar280._0_4_ = auVar33._0_4_ * auVar24._0_4_;
            auVar280._4_4_ = auVar33._4_4_ * auVar24._4_4_;
            auVar280._8_4_ = auVar33._8_4_ * auVar24._8_4_;
            auVar280._12_4_ = auVar33._12_4_ * auVar24._12_4_;
            auVar225 = vfmsub231ps_fma(auVar280,auVar86,auVar225);
            auVar147._0_4_ = auVar35._0_4_ * fVar251;
            auVar147._4_4_ = auVar35._4_4_ * fVar267;
            auVar147._8_4_ = auVar35._8_4_ * fVar269;
            auVar147._12_4_ = auVar35._12_4_ * fVar271;
            auVar24 = vfmsub231ps_fma(auVar147,auVar86,auVar289);
            auVar230._0_4_ = auVar33._0_4_ * auVar289._0_4_;
            auVar230._4_4_ = auVar33._4_4_ * auVar289._4_4_;
            auVar230._8_4_ = auVar33._8_4_ * auVar289._8_4_;
            auVar230._12_4_ = auVar33._12_4_ * auVar289._12_4_;
            auVar34 = vfmsub231ps_fma(auVar230,auVar34,auVar273);
            auVar308._0_4_ = auVar273._0_4_ * auVar86._0_4_;
            auVar308._4_4_ = auVar273._4_4_ * auVar86._4_4_;
            auVar308._8_4_ = auVar273._8_4_ * auVar86._8_4_;
            auVar308._12_4_ = auVar273._12_4_ * auVar86._12_4_;
            auVar89 = vfmsub231ps_fma(auVar308,auVar33,auVar35);
            auVar344._0_4_ = fVar251 * auVar87._0_4_;
            auVar344._4_4_ = fVar267 * auVar87._4_4_;
            auVar344._8_4_ = fVar269 * auVar87._8_4_;
            auVar344._12_4_ = fVar271 * auVar87._12_4_;
            auVar86 = vfmadd231ps_fma(auVar344,auVar353,auVar86);
            auVar273 = vfmadd231ps_fma(auVar86,auVar115,auVar33);
            auVar33 = vdivps_avx(auVar115,auVar273);
            auVar289 = vdivps_avx(auVar71,auVar273);
            auVar115 = vdivps_avx(auVar24,auVar273);
            auVar86 = vdivps_avx(auVar353,auVar273);
            _local_358 = vdivps_avx(auVar88,auVar273);
            _local_368 = vdivps_avx(auVar34,auVar273);
            auVar34 = vdivps_avx(auVar87,auVar273);
            auVar35 = vdivps_avx(auVar225,auVar273);
            auVar273 = vdivps_avx(auVar89,auVar273);
            auVar281._0_4_ = fVar23 * auVar34._0_4_;
            auVar281._4_4_ = fVar65 * auVar34._4_4_;
            auVar281._8_4_ = fVar66 * auVar34._8_4_;
            auVar281._12_4_ = fVar67 * auVar34._12_4_;
            auVar295._0_4_ = fVar23 * auVar35._0_4_;
            auVar295._4_4_ = fVar65 * auVar35._4_4_;
            auVar295._8_4_ = fVar66 * auVar35._8_4_;
            auVar295._12_4_ = fVar67 * auVar35._12_4_;
            auVar334._0_4_ = fVar23 * auVar273._0_4_;
            auVar334._4_4_ = fVar65 * auVar273._4_4_;
            auVar334._8_4_ = fVar66 * auVar273._8_4_;
            auVar334._12_4_ = fVar67 * auVar273._12_4_;
            auVar353 = vfmadd231ps_fma(auVar281,auVar357,auVar86);
            auVar225 = vfmadd231ps_fma(auVar295,auVar357,_local_358);
            auVar71 = vfmadd231ps_fma(auVar334,_local_368,auVar357);
            auVar353 = vfmadd231ps_fma(auVar353,_local_388,auVar33);
          }
          else {
            if (uVar17 != 0) {
              lVar6 = *(long *)&pGVar16[1].fnumTimeSegments;
              _local_388 = auVar24;
              do {
                uVar3 = 0;
                for (uVar17 = uVar17 & 0xff; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
                  uVar3 = uVar3 + 1;
                }
                iVar4 = *(int *)(local_98 + (ulong)uVar3 * 4);
                auVar86._4_4_ = iVar4;
                auVar86._0_4_ = iVar4;
                auVar86._8_4_ = iVar4;
                auVar86._12_4_ = iVar4;
                auVar33 = vpcmpeqd_avx(auVar86,local_98);
                auVar33 = vpand_avx(auVar33,_local_388);
                lVar20 = (long)iVar4 * 0x38;
                plVar2 = (long *)(lVar6 + lVar20);
                iVar4 = *(int *)(lVar6 + 0x20 + lVar20);
                if (iVar4 == 0x9134) {
                  lVar18 = *plVar2;
                  lVar21 = plVar2[2] * uVar14;
                  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),
                                          ZEXT416(*(uint *)(lVar18 + 0x10 + lVar21)),0x1c);
                  local_108 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar21)),0x28)
                  ;
                  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),
                                          ZEXT416(*(uint *)(lVar18 + 0x14 + lVar21)),0x1c);
                  local_118 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),0x28)
                  ;
                  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),
                                          ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),0x1c);
                  local_138 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar21)),0x28)
                  ;
                  auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                          ZEXT416(*(uint *)(lVar18 + 0x1c + lVar21)),0x1c);
                  local_128 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar21)),0x28)
                  ;
                }
                else if (iVar4 == 0x9234) {
                  lVar18 = *plVar2;
                  lVar21 = plVar2[2] * uVar14;
                  auVar87._8_8_ = 0;
                  auVar87._0_8_ = *(ulong *)(lVar18 + 4 + lVar21);
                  auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar87,0x4c);
                  local_108 = vshufps_avx(auVar86,auVar86,0x78);
                  auVar88._8_8_ = 0;
                  auVar88._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
                  auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),auVar88,0x4c);
                  local_118 = vshufps_avx(auVar86,auVar86,0x78);
                  auVar89._8_8_ = 0;
                  auVar89._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
                  auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar89,0x4c);
                  local_138 = vshufps_avx(auVar86,auVar86,0x78);
                  auVar90._8_8_ = 0;
                  auVar90._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar21);
                  auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),auVar90,0x4c);
                  local_128 = vshufps_avx(auVar86,auVar86,0x78);
                }
                else if (iVar4 == 0xb001) {
                  lVar18 = *plVar2;
                  lVar21 = plVar2[2] * uVar14;
                  auVar91._8_8_ = 0;
                  auVar91._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
                  auVar86 = vinsertps_avx(auVar91,ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),0x20);
                  auVar148._8_8_ = 0;
                  auVar148._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar21);
                  auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar148);
                  auVar35 = vshufps_avx(auVar34,auVar148,0xd8);
                  auVar215._8_8_ = 0;
                  auVar215._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
                  auVar34 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar215);
                  auVar289 = vshufps_avx(auVar34,auVar215,0xd8);
                  fVar251 = *(float *)(lVar18 + 0x24 + lVar21);
                  fVar267 = *(float *)(lVar18 + 0x28 + lVar21);
                  fVar269 = *(float *)(lVar18 + 0x2c + lVar21);
                  fVar271 = *(float *)(lVar18 + 0x30 + lVar21);
                  auVar34 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),
                                            ZEXT416((uint)fVar251),ZEXT416((uint)fVar251));
                  auVar34 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
                  auVar115 = vfmadd231ss_fma(auVar34,ZEXT416((uint)fVar271),ZEXT416((uint)fVar271));
                  auVar34 = vrsqrtss_avx(auVar115,auVar115);
                  fVar154 = auVar34._0_4_;
                  fVar154 = fVar154 * 1.5 + fVar154 * fVar154 * fVar154 * auVar115._0_4_ * -0.5;
                  local_128 = vinsertps_avx(auVar289,ZEXT416((uint)(fVar154 * fVar251)),0x30);
                  local_108 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar154 * fVar267)),0x30);
                  auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                          ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),0x10);
                  local_138 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar271 * fVar154)),0x30);
                  auVar86 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar21)),0x20);
                  local_118 = vinsertps_avx(auVar86,ZEXT416((uint)(fVar154 * fVar269)),0x30);
                }
                else if (iVar4 == 0x9244) {
                  lVar18 = *plVar2;
                  lVar21 = plVar2[2] * uVar14;
                  local_108 = *(undefined1 (*) [16])(lVar18 + lVar21);
                  local_118 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar21);
                  local_138 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar21);
                  local_128 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar21);
                }
                _local_388 = auVar33 ^ _local_388;
                uVar22 = local_108._0_4_;
                auVar86 = vshufps_avx(local_108,local_108,0x55);
                local_48 = vshufps_avx(local_108,local_108,0xaa);
                auVar34 = vshufps_avx(local_108,local_108,0xff);
                local_58._4_4_ = local_118._0_4_;
                local_58._0_4_ = local_58._4_4_;
                local_58._8_4_ = local_58._4_4_;
                local_58._12_4_ = local_58._4_4_;
                local_68 = vshufps_avx(local_118,local_118,0x55);
                local_78 = vshufps_avx(local_118,local_118,0xaa);
                auVar35 = vshufps_avx(local_118,local_118,0xff);
                uVar68 = local_138._0_4_;
                auVar282._4_4_ = uVar68;
                auVar282._0_4_ = uVar68;
                auVar282._8_4_ = uVar68;
                auVar282._12_4_ = uVar68;
                auVar289 = vshufps_avx(local_138,local_138,0x55);
                auVar115 = vshufps_avx(local_138,local_138,0xaa);
                auVar225 = vshufps_avx(local_138,local_138,0xff);
                uVar68 = local_128._0_4_;
                auVar335._4_4_ = uVar68;
                auVar335._0_4_ = uVar68;
                auVar335._8_4_ = uVar68;
                auVar335._12_4_ = uVar68;
                auVar353 = vshufps_avx(local_128,local_128,0x55);
                auVar71 = vshufps_avx(local_128,local_128,0xaa);
                auVar24 = vshufps_avx(local_128,local_128,0xff);
                iVar4 = *(int *)(lVar6 + 0x58 + lVar20);
                if (iVar4 == 0x9134) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 0x10 + lVar18)),0x1c);
                  local_278 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(lVar20 + 0x20 + lVar18)),0x28)
                  ;
                  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 4 + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 0x14 + lVar18)),0x1c);
                  local_218 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(lVar20 + 0x24 + lVar18)),0x28)
                  ;
                  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 8 + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),0x1c);
                  local_228 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(lVar20 + 0x28 + lVar18)),0x28)
                  ;
                  auVar87 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 0x1c + lVar18)),0x1c);
                  local_238 = vinsertps_avx(auVar87,ZEXT416(*(uint *)(lVar20 + 0x2c + lVar18)),0x28)
                  ;
                }
                else if (iVar4 == 0x9234) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  auVar92._8_8_ = 0;
                  auVar92._0_8_ = *(ulong *)(lVar20 + 4 + lVar18);
                  auVar87 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),auVar92,0x4c);
                  local_278 = vshufps_avx(auVar87,auVar87,0x78);
                  auVar93._8_8_ = 0;
                  auVar93._0_8_ = *(ulong *)(lVar20 + 0x10 + lVar18);
                  auVar87 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),auVar93,0x4c);
                  local_218 = vshufps_avx(auVar87,auVar87,0x78);
                  auVar94._8_8_ = 0;
                  auVar94._0_8_ = *(ulong *)(lVar20 + 0x1c + lVar18);
                  auVar87 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),auVar94,0x4c);
                  local_228 = vshufps_avx(auVar87,auVar87,0x78);
                  auVar95._8_8_ = 0;
                  auVar95._0_8_ = *(ulong *)(lVar20 + 0x28 + lVar18);
                  auVar87 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0x24 + lVar18)),auVar95,0x4c);
                  local_238 = vshufps_avx(auVar87,auVar87,0x78);
                }
                else if (iVar4 == 0xb001) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  auVar96._8_8_ = 0;
                  auVar96._0_8_ = *(ulong *)(lVar20 + 0x10 + lVar18);
                  auVar87 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(lVar20 + 8 + lVar18)),0x20);
                  auVar97._8_8_ = 0;
                  auVar97._0_8_ = *(ulong *)(lVar20 + 0x34 + lVar18);
                  auVar88 = vmovlhps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),auVar97);
                  auVar89 = vshufps_avx(auVar88,auVar97,0xd8);
                  auVar98._8_8_ = 0;
                  auVar98._0_8_ = *(ulong *)(lVar20 + 0x1c + lVar18);
                  auVar88 = vmovlhps_avx(ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),auVar98);
                  auVar90 = vshufps_avx(auVar88,auVar98,0xd8);
                  fVar251 = *(float *)(lVar20 + 0x24 + lVar18);
                  fVar267 = *(float *)(lVar20 + 0x28 + lVar18);
                  fVar269 = *(float *)(lVar20 + 0x2c + lVar18);
                  fVar271 = *(float *)(lVar20 + 0x30 + lVar18);
                  auVar88 = vfmadd231ss_fma(ZEXT416((uint)(fVar267 * fVar267)),
                                            ZEXT416((uint)fVar251),ZEXT416((uint)fVar251));
                  auVar88 = vfmadd231ss_fma(auVar88,ZEXT416((uint)fVar269),ZEXT416((uint)fVar269));
                  auVar91 = vfmadd231ss_fma(auVar88,ZEXT416((uint)fVar271),ZEXT416((uint)fVar271));
                  auVar88 = vrsqrtss_avx(auVar91,auVar91);
                  fVar154 = auVar88._0_4_;
                  fVar154 = fVar154 * 1.5 + fVar154 * fVar154 * fVar154 * auVar91._0_4_ * -0.5;
                  local_238 = vinsertps_avx(auVar90,ZEXT416((uint)(fVar251 * fVar154)),0x30);
                  local_278 = vinsertps_avx(auVar89,ZEXT416((uint)(fVar267 * fVar154)),0x30);
                  auVar88 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 4 + lVar18)),0x10);
                  local_228 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar271 * fVar154)),0x30);
                  auVar87 = vinsertps_avx(auVar88,ZEXT416(*(uint *)(lVar20 + 0x3c + lVar18)),0x20);
                  local_218 = vinsertps_avx(auVar87,ZEXT416((uint)(fVar269 * fVar154)),0x30);
                }
                else if (iVar4 == 0x9244) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  local_278 = *(undefined1 (*) [16])(lVar20 + lVar18);
                  local_218 = *(undefined1 (*) [16])(lVar20 + 0x10 + lVar18);
                  local_228 = *(undefined1 (*) [16])(lVar20 + 0x20 + lVar18);
                  local_238 = *(undefined1 (*) [16])(lVar20 + 0x30 + lVar18);
                }
                auVar343._4_4_ = uVar22;
                auVar343._0_4_ = uVar22;
                auVar343._8_4_ = uVar22;
                auVar343._12_4_ = uVar22;
                local_d8 = vblendvps_avx(local_d8,auVar343,auVar33);
                local_b8 = vblendvps_avx(local_b8,auVar86,auVar33);
                _local_268 = vblendvps_avx(_local_268,local_48,auVar33);
                _local_328 = vblendvps_avx(_local_328,auVar34,auVar33);
                local_1b8 = vblendvps_avx(local_1b8,local_58,auVar33);
                local_2b8 = vblendvps_avx(local_2b8,local_68,auVar33);
                local_198 = vblendvps_avx(local_198,local_78,auVar33);
                _local_358 = vblendvps_avx(_local_358,auVar35,auVar33);
                local_248 = vblendvps_avx(local_248,auVar282,auVar33);
                _local_298 = vblendvps_avx(_local_298,auVar289,auVar33);
                _local_318 = vblendvps_avx(_local_318,auVar115,auVar33);
                _local_368 = vblendvps_avx(_local_368,auVar225,auVar33);
                _local_338 = vblendvps_avx(_local_338,auVar335,auVar33);
                _local_2f8 = vblendvps_avx(_local_2f8,auVar353,auVar33);
                _local_2e8 = vblendvps_avx(_local_2e8,auVar71,auVar33);
                _local_378 = vblendvps_avx(_local_378,auVar24,auVar33);
                uVar22 = local_278._0_4_;
                auVar99._4_4_ = uVar22;
                auVar99._0_4_ = uVar22;
                auVar99._8_4_ = uVar22;
                auVar99._12_4_ = uVar22;
                _local_e8 = vblendvps_avx(_local_e8,auVar99,auVar33);
                auVar86 = vshufps_avx(local_278,local_278,0x55);
                _local_c8 = vblendvps_avx(_local_c8,auVar86,auVar33);
                auVar86 = vshufps_avx(local_278,local_278,0xaa);
                _local_a8 = vblendvps_avx(_local_a8,auVar86,auVar33);
                auVar86 = vshufps_avx(local_278,local_278,0xff);
                local_f8 = vblendvps_avx(local_f8,auVar86,auVar33);
                uVar22 = local_218._0_4_;
                auVar100._4_4_ = uVar22;
                auVar100._0_4_ = uVar22;
                auVar100._8_4_ = uVar22;
                auVar100._12_4_ = uVar22;
                _local_1c8 = vblendvps_avx(_local_1c8,auVar100,auVar33);
                auVar86 = vshufps_avx(local_218,local_218,0x55);
                _local_258 = vblendvps_avx(_local_258,auVar86,auVar33);
                auVar86 = vshufps_avx(local_218,local_218,0xaa);
                _local_1a8 = vblendvps_avx(_local_1a8,auVar86,auVar33);
                auVar86 = vshufps_avx(local_218,local_218,0xff);
                local_1e8 = vblendvps_avx(local_1e8,auVar86,auVar33);
                uVar22 = local_228._0_4_;
                auVar101._4_4_ = uVar22;
                auVar101._0_4_ = uVar22;
                auVar101._8_4_ = uVar22;
                auVar101._12_4_ = uVar22;
                _local_188 = vblendvps_avx(_local_188,auVar101,auVar33);
                auVar86 = vshufps_avx(local_228,local_228,0x55);
                _local_2a8 = vblendvps_avx(_local_2a8,auVar86,auVar33);
                auVar86 = vshufps_avx(local_228,local_228,0xaa);
                _local_2c8 = vblendvps_avx(_local_2c8,auVar86,auVar33);
                auVar86 = vshufps_avx(local_228,local_228,0xff);
                local_1d8 = vblendvps_avx(local_1d8,auVar86,auVar33);
                uVar22 = local_238._0_4_;
                auVar102._4_4_ = uVar22;
                auVar102._0_4_ = uVar22;
                auVar102._8_4_ = uVar22;
                auVar102._12_4_ = uVar22;
                _local_2d8 = vblendvps_avx(_local_2d8,auVar102,auVar33);
                auVar86 = vshufps_avx(local_238,local_238,0x55);
                _local_308 = vblendvps_avx(_local_308,auVar86,auVar33);
                auVar86 = vshufps_avx(local_238,local_238,0xaa);
                _local_348 = vblendvps_avx(_local_348,auVar86,auVar33);
                auVar86 = vshufps_avx(local_238,local_238,0xff);
                local_1f8 = vblendvps_avx(local_1f8,auVar86,auVar33);
                uVar17 = vmovmskps_avx(_local_388);
              } while (uVar17 != 0);
            }
            auVar128._0_4_ =
                 local_1d8._0_4_ * (float)local_368._0_4_ +
                 local_1e8._0_4_ * (float)local_358._0_4_ +
                 local_f8._0_4_ * (float)local_328._0_4_ + local_1f8._0_4_ * local_378._0_4_;
            auVar128._4_4_ =
                 local_1d8._4_4_ * (float)local_368._4_4_ +
                 local_1e8._4_4_ * (float)local_358._4_4_ +
                 local_f8._4_4_ * (float)local_328._4_4_ + local_1f8._4_4_ * local_378._4_4_;
            auVar128._8_4_ =
                 local_1d8._8_4_ * fStack_360 +
                 local_1e8._8_4_ * (float)uStack_350 +
                 local_f8._8_4_ * (float)uStack_320 + local_1f8._8_4_ * local_378._8_4_;
            auVar128._12_4_ =
                 local_1d8._12_4_ * fStack_35c +
                 local_1e8._12_4_ * uStack_350._4_4_ +
                 local_f8._12_4_ * uStack_320._4_4_ + local_1f8._12_4_ * local_378._12_4_;
            uVar14 = CONCAT44(auVar128._4_4_,auVar128._0_4_);
            auVar103._0_8_ = uVar14 ^ 0x8000000080000000;
            auVar103._8_4_ = -auVar128._8_4_;
            auVar103._12_4_ = -auVar128._12_4_;
            auVar33 = vcmpps_avx(auVar128,auVar103,1);
            auVar177._0_8_ = local_1f8._0_8_ ^ 0x8000000080000000;
            auVar177._8_4_ = -local_1f8._8_4_;
            auVar177._12_4_ = -local_1f8._12_4_;
            auVar86 = vblendvps_avx(local_1f8,auVar177,auVar33);
            auVar178._0_8_ = local_f8._0_8_ ^ 0x8000000080000000;
            auVar178._8_4_ = -local_f8._8_4_;
            auVar178._12_4_ = -local_f8._12_4_;
            auVar34 = vblendvps_avx(local_f8,auVar178,auVar33);
            auVar179._0_8_ = local_1e8._0_8_ ^ 0x8000000080000000;
            auVar179._8_4_ = -local_1e8._8_4_;
            auVar179._12_4_ = -local_1e8._12_4_;
            auVar35 = vblendvps_avx(local_1e8,auVar179,auVar33);
            auVar231._0_8_ = local_1d8._0_8_ ^ 0x8000000080000000;
            auVar231._8_4_ = -local_1d8._8_4_;
            auVar231._12_4_ = -local_1d8._12_4_;
            auVar289 = vblendvps_avx(local_1d8,auVar231,auVar33);
            auVar71 = vmaxps_avx(auVar103,auVar128);
            auVar232._8_4_ = 0x7fffffff;
            auVar232._0_8_ = 0x7fffffff7fffffff;
            auVar232._12_4_ = 0x7fffffff;
            auVar33 = vandps_avx(auVar128,auVar232);
            fVar251 = auVar33._0_4_;
            fVar267 = auVar33._4_4_;
            fVar269 = auVar33._8_4_;
            fVar271 = auVar33._12_4_;
            auVar129._8_4_ = 0x3f800000;
            auVar129._0_8_ = &DAT_3f8000003f800000;
            auVar129._12_4_ = 0x3f800000;
            auVar115 = vsubps_avx(auVar129,auVar33);
            auVar115 = vsqrtps_avx(auVar115);
            auVar233._0_4_ =
                 auVar115._0_4_ *
                 (fVar251 * (fVar251 * (fVar251 * (fVar251 * (fVar251 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar233._4_4_ =
                 auVar115._4_4_ *
                 (fVar267 * (fVar267 * (fVar267 * (fVar267 * (fVar267 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar233._8_4_ =
                 auVar115._8_4_ *
                 (fVar269 * (fVar269 * (fVar269 * (fVar269 * (fVar269 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar233._12_4_ =
                 auVar115._12_4_ *
                 (fVar271 * (fVar271 * (fVar271 * (fVar271 * (fVar271 * -0.0043095737 + 0.0192803) +
                                                  -0.04489909) + 0.08785567) + -0.21450998) +
                 1.5707952);
            auVar296._8_4_ = 0x3fc90fdb;
            auVar296._0_8_ = 0x3fc90fdb3fc90fdb;
            auVar296._12_4_ = 0x3fc90fdb;
            auVar115 = vsubps_avx(auVar296,auVar233);
            auVar24 = ZEXT816(0) << 0x20;
            auVar225 = vmaxps_avx(auVar24,auVar115);
            auVar115 = vcmpps_avx(auVar71,auVar24,1);
            auVar336._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
            auVar336._8_4_ = auVar225._8_4_ ^ 0x80000000;
            auVar336._12_4_ = auVar225._12_4_ ^ 0x80000000;
            auVar115 = vblendvps_avx(auVar225,auVar336,auVar115);
            auVar33 = vcmpps_avx(auVar33,auVar129,6);
            auVar115 = vsubps_avx(auVar296,auVar115);
            auVar309._8_4_ = 0x7fc00000;
            auVar309._0_8_ = 0x7fc000007fc00000;
            auVar309._12_4_ = 0x7fc00000;
            auVar33 = vblendvps_avx(auVar115,auVar309,auVar33);
            auVar260._0_4_ = auVar33._0_4_ * fVar23;
            auVar260._4_4_ = auVar33._4_4_ * fVar65;
            auVar260._8_4_ = auVar33._8_4_ * fVar66;
            auVar260._12_4_ = auVar33._12_4_ * fVar67;
            auVar283._0_4_ = auVar260._0_4_ * 0.63661975;
            auVar283._4_4_ = auVar260._4_4_ * 0.63661975;
            auVar283._8_4_ = auVar260._8_4_ * 0.63661975;
            auVar283._12_4_ = auVar260._12_4_ * 0.63661975;
            auVar33 = vroundps_avx(auVar283,1);
            auVar297._0_4_ = auVar33._0_4_ * 1.5707964;
            auVar297._4_4_ = auVar33._4_4_ * 1.5707964;
            auVar297._8_4_ = auVar33._8_4_ * 1.5707964;
            auVar297._12_4_ = auVar33._12_4_ * 1.5707964;
            auVar115 = vsubps_avx(auVar260,auVar297);
            fVar251 = auVar115._0_4_;
            fVar154 = fVar251 * fVar251;
            fVar267 = auVar115._4_4_;
            fVar194 = fVar267 * fVar267;
            fVar269 = auVar115._8_4_;
            fVar195 = fVar269 * fVar269;
            fVar271 = auVar115._12_4_;
            fVar196 = fVar271 * fVar271;
            auVar298._0_4_ =
                 fVar251 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar298._4_4_ =
                 fVar267 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar298._8_4_ =
                 fVar269 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar298._12_4_ =
                 fVar271 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * -2.5029328e-08 +
                                                                       2.7600126e-06) +
                                                            -0.00019842605) + 0.008333348) +
                                      -0.16666667) + 1.0);
            auVar353 = vcvtps2dq_avx(auVar33);
            auVar337._8_4_ = 1;
            auVar337._0_8_ = 0x100000001;
            auVar337._12_4_ = 1;
            auVar33 = vandpd_avx(auVar353,auVar337);
            auVar225 = vpcmpeqd_avx(auVar33,auVar24);
            auVar33 = vpsubd_avx(auVar24,auVar33);
            auVar310._0_4_ =
                 fVar154 * (fVar154 * (fVar154 * (fVar154 * (fVar154 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar310._4_4_ =
                 fVar194 * (fVar194 * (fVar194 * (fVar194 * (fVar194 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar310._8_4_ =
                 fVar195 * (fVar195 * (fVar195 * (fVar195 * (fVar195 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar310._12_4_ =
                 fVar196 * (fVar196 * (fVar196 * (fVar196 * (fVar196 * -2.5963018e-07 +
                                                            2.4756235e-05) + -0.001388833) +
                                      0.04166664) + -0.5) + 1.0;
            auVar115 = vblendvps_avx(auVar298,auVar310,auVar33);
            auVar225 = vblendvps_avx(auVar298,auVar310,auVar225);
            auVar299._8_4_ = 3;
            auVar299._0_8_ = 0x300000003;
            auVar299._12_4_ = 3;
            auVar33 = vandpd_avx(auVar353,auVar299);
            auVar353 = vpcmpgtd_avx(auVar33,auVar337);
            auVar351._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
            auVar351._8_4_ = auVar115._8_4_ ^ 0x80000000;
            auVar351._12_4_ = auVar115._12_4_ ^ 0x80000000;
            auVar353 = vblendvps_avx(auVar115,auVar351,auVar353);
            auVar115 = vpcmpeqd_avx(auVar115,auVar115);
            auVar33 = vpaddd_avx(auVar33,auVar115);
            auVar115 = vpminud_avx(auVar33,auVar337);
            auVar33 = vpcmpeqd_avx(auVar33,auVar115);
            auVar54._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
            auVar54._8_4_ = auVar225._8_4_ ^ 0x80000000;
            auVar54._12_4_ = auVar225._12_4_ ^ 0x80000000;
            auVar33 = vblendvps_avx(auVar225,auVar54,auVar33);
            auVar115 = vfmsub213ps_fma(_local_378,auVar71,auVar86);
            auVar225 = vfmsub213ps_fma(_local_328,auVar71,auVar34);
            fVar251 = auVar115._0_4_;
            fVar195 = auVar115._4_4_;
            fVar238 = auVar115._8_4_;
            fVar10 = auVar115._12_4_;
            fVar267 = auVar225._0_4_;
            fVar196 = auVar225._4_4_;
            fVar7 = auVar225._8_4_;
            fVar266 = auVar225._12_4_;
            auVar115 = vfmsub213ps_fma(_local_358,auVar71,auVar35);
            fVar269 = auVar115._0_4_;
            fVar221 = auVar115._4_4_;
            fVar8 = auVar115._8_4_;
            fVar268 = auVar115._12_4_;
            auVar115 = vfmsub213ps_fma(_local_368,auVar71,auVar289);
            fVar271 = auVar115._0_4_;
            fVar236 = auVar115._4_4_;
            fVar9 = auVar115._8_4_;
            fVar270 = auVar115._12_4_;
            auVar55._0_4_ =
                 fVar271 * fVar271 + fVar269 * fVar269 + fVar267 * fVar267 + fVar251 * fVar251;
            auVar55._4_4_ =
                 fVar236 * fVar236 + fVar221 * fVar221 + fVar196 * fVar196 + fVar195 * fVar195;
            auVar55._8_4_ = fVar9 * fVar9 + fVar8 * fVar8 + fVar7 * fVar7 + fVar238 * fVar238;
            auVar55._12_4_ =
                 fVar270 * fVar270 + fVar268 * fVar268 + fVar266 * fVar266 + fVar10 * fVar10;
            auVar115 = vrsqrtps_avx(auVar55);
            fVar154 = auVar115._0_4_;
            fVar194 = auVar115._4_4_;
            fVar237 = auVar115._8_4_;
            fVar360 = auVar115._12_4_;
            auVar130._0_4_ = fVar154 * auVar55._0_4_ * -0.5 * fVar154 * fVar154;
            auVar130._4_4_ = fVar194 * auVar55._4_4_ * -0.5 * fVar194 * fVar194;
            auVar130._8_4_ = fVar237 * auVar55._8_4_ * -0.5 * fVar237 * fVar237;
            auVar130._12_4_ = fVar360 * auVar55._12_4_ * -0.5 * fVar360 * fVar360;
            auVar56._8_4_ = 0x3fc00000;
            auVar56._0_8_ = 0x3fc000003fc00000;
            auVar56._12_4_ = 0x3fc00000;
            auVar115 = vfmadd231ps_fma(auVar130,auVar56,auVar115);
            fVar154 = auVar115._0_4_;
            fVar237 = auVar115._4_4_;
            fVar360 = auVar115._8_4_;
            fVar288 = auVar115._12_4_;
            fVar194 = auVar353._0_4_;
            auVar284._0_4_ = fVar251 * fVar154 * fVar194;
            fVar251 = auVar353._4_4_;
            auVar284._4_4_ = fVar195 * fVar237 * fVar251;
            fVar195 = auVar353._8_4_;
            auVar284._8_4_ = fVar238 * fVar360 * fVar195;
            fVar238 = auVar353._12_4_;
            auVar284._12_4_ = fVar10 * fVar288 * fVar238;
            auVar338._0_4_ = fVar267 * fVar154 * fVar194;
            auVar338._4_4_ = fVar196 * fVar237 * fVar251;
            auVar338._8_4_ = fVar7 * fVar360 * fVar195;
            auVar338._12_4_ = fVar266 * fVar288 * fVar238;
            auVar345._0_4_ = fVar269 * fVar154 * fVar194;
            auVar345._4_4_ = fVar221 * fVar237 * fVar251;
            auVar345._8_4_ = fVar8 * fVar360 * fVar195;
            auVar345._12_4_ = fVar268 * fVar288 * fVar238;
            auVar300._0_4_ = fVar194 * fVar271 * fVar154;
            auVar300._4_4_ = fVar251 * fVar236 * fVar237;
            auVar300._8_4_ = fVar195 * fVar9 * fVar360;
            auVar300._12_4_ = fVar238 * fVar270 * fVar288;
            auVar115 = vfmsub231ps_fma(auVar284,auVar33,_local_378);
            auVar225 = vfmsub231ps_fma(auVar338,auVar33,_local_328);
            auVar353 = vfmsub231ps_fma(auVar345,auVar33,_local_358);
            auVar24 = vfmsub231ps_fma(auVar300,_local_368,auVar33);
            auVar33 = vsubps_avx(auVar86,_local_378);
            auVar86 = vfmadd213ps_fma(auVar33,auVar273,_local_378);
            auVar33 = vsubps_avx(auVar34,_local_328);
            auVar34 = vfmadd213ps_fma(auVar33,auVar273,_local_328);
            auVar33 = vsubps_avx(auVar35,_local_358);
            auVar35 = vfmadd213ps_fma(auVar33,auVar273,_local_358);
            auVar33 = vsubps_avx(auVar289,_local_368);
            auVar33 = vfmadd213ps_fma(auVar33,auVar273,_local_368);
            fVar251 = auVar86._0_4_;
            fVar194 = auVar86._4_4_;
            fVar237 = auVar86._8_4_;
            fVar360 = auVar86._12_4_;
            fVar267 = auVar34._0_4_;
            fVar195 = auVar34._4_4_;
            fVar238 = auVar34._8_4_;
            fVar10 = auVar34._12_4_;
            fVar269 = auVar35._0_4_;
            fVar196 = auVar35._4_4_;
            fVar7 = auVar35._8_4_;
            fVar266 = auVar35._12_4_;
            fVar271 = auVar33._0_4_;
            fVar221 = auVar33._4_4_;
            fVar8 = auVar33._8_4_;
            fVar268 = auVar33._12_4_;
            auVar247._0_4_ =
                 fVar271 * fVar271 + fVar269 * fVar269 + fVar267 * fVar267 + fVar251 * fVar251;
            auVar247._4_4_ =
                 fVar221 * fVar221 + fVar196 * fVar196 + fVar195 * fVar195 + fVar194 * fVar194;
            auVar247._8_4_ = fVar8 * fVar8 + fVar7 * fVar7 + fVar238 * fVar238 + fVar237 * fVar237;
            auVar247._12_4_ =
                 fVar268 * fVar268 + fVar266 * fVar266 + fVar10 * fVar10 + fVar360 * fVar360;
            auVar33 = vrsqrtps_avx(auVar247);
            fVar154 = auVar33._0_4_;
            fVar236 = auVar33._4_4_;
            fVar9 = auVar33._8_4_;
            fVar270 = auVar33._12_4_;
            auVar261._0_4_ = auVar247._0_4_ * -0.5 * fVar154 * fVar154 * fVar154;
            auVar261._4_4_ = auVar247._4_4_ * -0.5 * fVar236 * fVar236 * fVar236;
            auVar261._8_4_ = auVar247._8_4_ * -0.5 * fVar9 * fVar9 * fVar9;
            auVar261._12_4_ = auVar247._12_4_ * -0.5 * fVar270 * fVar270 * fVar270;
            auVar57._8_4_ = 0x3fc00000;
            auVar57._0_8_ = 0x3fc000003fc00000;
            auVar57._12_4_ = 0x3fc00000;
            auVar33 = vfmadd231ps_fma(auVar261,auVar33,auVar57);
            fVar154 = auVar33._0_4_;
            auVar58._0_4_ = fVar154 * fVar251;
            fVar251 = auVar33._4_4_;
            auVar58._4_4_ = fVar251 * fVar194;
            fVar194 = auVar33._8_4_;
            auVar58._8_4_ = fVar194 * fVar237;
            fVar236 = auVar33._12_4_;
            auVar58._12_4_ = fVar236 * fVar360;
            auVar131._0_4_ = fVar154 * fVar267;
            auVar131._4_4_ = fVar251 * fVar195;
            auVar131._8_4_ = fVar194 * fVar238;
            auVar131._12_4_ = fVar236 * fVar10;
            auVar180._0_4_ = fVar154 * fVar269;
            auVar180._4_4_ = fVar251 * fVar196;
            auVar180._8_4_ = fVar194 * fVar7;
            auVar180._12_4_ = fVar236 * fVar266;
            auVar216._0_4_ = fVar154 * fVar271;
            auVar216._4_4_ = fVar251 * fVar221;
            auVar216._8_4_ = fVar194 * fVar8;
            auVar216._12_4_ = fVar236 * fVar268;
            auVar149._8_4_ = 0x3f7fdf3b;
            auVar149._0_8_ = 0x3f7fdf3b3f7fdf3b;
            auVar149._12_4_ = 0x3f7fdf3b;
            auVar35 = vcmpps_avx(auVar71,auVar149,6);
            auVar33 = vblendvps_avx(auVar115,auVar58,auVar35);
            auVar86 = vblendvps_avx(auVar225,auVar131,auVar35);
            auVar34 = vblendvps_avx(auVar353,auVar180,auVar35);
            auVar35 = vblendvps_avx(auVar24,auVar216,auVar35);
            auVar132._8_4_ = 0x3f800000;
            auVar132._0_8_ = &DAT_3f8000003f800000;
            auVar132._12_4_ = 0x3f800000;
            auVar273 = vsubps_avx(auVar132,auVar273);
            auVar181._0_4_ = fVar23 * (float)local_e8._0_4_;
            auVar181._4_4_ = fVar65 * (float)local_e8._4_4_;
            auVar181._8_4_ = fVar66 * fStack_e0;
            auVar181._12_4_ = fVar67 * fStack_dc;
            auVar225 = vfmadd231ps_fma(auVar181,auVar273,local_d8);
            auVar352._0_4_ = fVar23 * (float)local_c8._0_4_;
            auVar352._4_4_ = fVar65 * (float)local_c8._4_4_;
            auVar352._8_4_ = fVar66 * fStack_c0;
            auVar352._12_4_ = fVar67 * fStack_bc;
            auVar353 = vfmadd231ps_fma(auVar352,auVar273,local_b8);
            auVar182._0_4_ = fVar23 * (float)local_a8._0_4_;
            auVar182._4_4_ = fVar65 * (float)local_a8._4_4_;
            auVar182._8_4_ = fVar66 * fStack_a0;
            auVar182._12_4_ = fVar67 * fStack_9c;
            auVar71 = vfmadd231ps_fma(auVar182,auVar273,_local_268);
            auVar183._0_4_ = fVar23 * (float)local_1c8._0_4_;
            auVar183._4_4_ = fVar65 * (float)local_1c8._4_4_;
            auVar183._8_4_ = fVar66 * fStack_1c0;
            auVar183._12_4_ = fVar67 * fStack_1bc;
            auVar24 = vfmadd231ps_fma(auVar183,auVar273,local_1b8);
            auVar184._0_4_ = fVar23 * (float)local_258._0_4_;
            auVar184._4_4_ = fVar65 * (float)local_258._4_4_;
            auVar184._8_4_ = fVar66 * fStack_250;
            auVar184._12_4_ = fVar67 * fStack_24c;
            auVar87 = vfmadd231ps_fma(auVar184,auVar273,local_2b8);
            auVar346._0_4_ = fVar23 * (float)local_1a8._0_4_;
            auVar346._4_4_ = fVar65 * (float)local_1a8._4_4_;
            auVar346._8_4_ = fVar66 * fStack_1a0;
            auVar346._12_4_ = fVar67 * fStack_19c;
            auVar88 = vfmadd231ps_fma(auVar346,auVar273,local_198);
            auVar185._0_4_ = fVar23 * (float)local_188._0_4_;
            auVar185._4_4_ = fVar65 * (float)local_188._4_4_;
            auVar185._8_4_ = fVar66 * fStack_180;
            auVar185._12_4_ = fVar67 * fStack_17c;
            auVar89 = vfmadd231ps_fma(auVar185,auVar273,local_248);
            auVar186._0_4_ = fVar23 * (float)local_2a8._0_4_;
            auVar186._4_4_ = fVar65 * (float)local_2a8._4_4_;
            auVar186._8_4_ = fVar66 * fStack_2a0;
            auVar186._12_4_ = fVar67 * fStack_29c;
            auVar90 = vfmadd231ps_fma(auVar186,auVar273,_local_298);
            auVar187._0_4_ = fVar23 * (float)local_2c8._0_4_;
            auVar187._4_4_ = fVar65 * (float)local_2c8._4_4_;
            auVar187._8_4_ = fVar66 * fStack_2c0;
            auVar187._12_4_ = fVar67 * fStack_2bc;
            auVar91 = vfmadd231ps_fma(auVar187,auVar273,_local_318);
            auVar188._0_4_ = fVar23 * (float)local_2d8._0_4_;
            auVar188._4_4_ = fVar65 * (float)local_2d8._4_4_;
            auVar188._8_4_ = fVar66 * fStack_2d0;
            auVar188._12_4_ = fVar67 * fStack_2cc;
            auVar217._0_4_ = fVar23 * (float)local_308._0_4_;
            auVar217._4_4_ = fVar65 * (float)local_308._4_4_;
            auVar217._8_4_ = fVar66 * fStack_300;
            auVar217._12_4_ = fVar67 * fStack_2fc;
            auVar234._0_4_ = fVar23 * (float)local_348._0_4_;
            auVar234._4_4_ = fVar65 * (float)local_348._4_4_;
            auVar234._8_4_ = fVar66 * (float)uStack_340;
            auVar234._12_4_ = fVar67 * uStack_340._4_4_;
            auVar148 = vfmadd231ps_fma(auVar188,auVar273,_local_338);
            auVar215 = vfmadd231ps_fma(auVar217,auVar273,_local_2f8);
            auVar282 = vfmadd231ps_fma(auVar234,auVar273,_local_2e8);
            fVar23 = auVar34._0_4_;
            fVar221 = auVar86._0_4_;
            auVar133._0_4_ = fVar221 * fVar23;
            fVar66 = auVar34._4_4_;
            fVar236 = auVar86._4_4_;
            auVar133._4_4_ = fVar236 * fVar66;
            fVar251 = auVar34._8_4_;
            fVar237 = auVar86._8_4_;
            auVar133._8_4_ = fVar237 * fVar251;
            fVar269 = auVar34._12_4_;
            fVar238 = auVar86._12_4_;
            auVar133._12_4_ = fVar238 * fVar269;
            fVar65 = auVar35._0_4_;
            fVar154 = auVar33._0_4_;
            auVar189._0_4_ = fVar154 * fVar65;
            fVar67 = auVar35._4_4_;
            fVar194 = auVar33._4_4_;
            auVar189._4_4_ = fVar194 * fVar67;
            fVar267 = auVar35._8_4_;
            fVar195 = auVar33._8_4_;
            auVar189._8_4_ = fVar195 * fVar267;
            fVar271 = auVar35._12_4_;
            fVar196 = auVar33._12_4_;
            auVar189._12_4_ = fVar196 * fVar271;
            auVar33 = vsubps_avx(auVar133,auVar189);
            auVar190._0_4_ = fVar154 * fVar154;
            auVar190._4_4_ = fVar194 * fVar194;
            auVar190._8_4_ = fVar195 * fVar195;
            auVar190._12_4_ = fVar196 * fVar196;
            auVar218._0_4_ = fVar221 * fVar221;
            auVar218._4_4_ = fVar236 * fVar236;
            auVar218._8_4_ = fVar237 * fVar237;
            auVar218._12_4_ = fVar238 * fVar238;
            auVar262._0_4_ = auVar190._0_4_ + auVar218._0_4_;
            auVar262._4_4_ = auVar190._4_4_ + auVar218._4_4_;
            auVar262._8_4_ = auVar190._8_4_ + auVar218._8_4_;
            auVar262._12_4_ = auVar190._12_4_ + auVar218._12_4_;
            auVar86 = vsubps_avx(auVar190,auVar218);
            auVar191._0_4_ = fVar221 * fVar65;
            auVar191._4_4_ = fVar236 * fVar67;
            auVar191._8_4_ = fVar237 * fVar267;
            auVar191._12_4_ = fVar238 * fVar271;
            auVar219._0_4_ = fVar221 * fVar154;
            auVar219._4_4_ = fVar236 * fVar194;
            auVar219._8_4_ = fVar237 * fVar195;
            auVar219._12_4_ = fVar238 * fVar196;
            auVar150._0_4_ = fVar154 * fVar23;
            auVar150._4_4_ = fVar194 * fVar66;
            auVar150._8_4_ = fVar195 * fVar251;
            auVar150._12_4_ = fVar196 * fVar269;
            auVar34 = vsubps_avx(auVar191,auVar150);
            auVar151._0_4_ = fVar23 * fVar65;
            auVar151._4_4_ = fVar66 * fVar67;
            auVar151._8_4_ = fVar251 * fVar267;
            auVar151._12_4_ = fVar269 * fVar271;
            auVar273 = vsubps_avx(auVar151,auVar219);
            auVar104._0_4_ = fVar23 * fVar23;
            auVar104._4_4_ = fVar66 * fVar66;
            auVar104._8_4_ = fVar251 * fVar251;
            auVar104._12_4_ = fVar269 * fVar269;
            auVar35 = vsubps_avx(auVar262,auVar104);
            auVar263._0_4_ = auVar86._0_4_ + auVar104._0_4_;
            auVar263._4_4_ = auVar86._4_4_ + auVar104._4_4_;
            auVar263._8_4_ = auVar86._8_4_ + auVar104._8_4_;
            auVar263._12_4_ = auVar86._12_4_ + auVar104._12_4_;
            auVar86 = vsubps_avx(auVar86,auVar104);
            auVar59._0_4_ = fVar65 * fVar65;
            auVar59._4_4_ = fVar67 * fVar67;
            auVar59._8_4_ = fVar267 * fVar267;
            auVar59._12_4_ = fVar271 * fVar271;
            auVar35 = vsubps_avx(auVar35,auVar59);
            auVar289 = vsubps_avx(auVar263,auVar59);
            auVar105._0_4_ = auVar59._0_4_ + auVar86._0_4_;
            auVar105._4_4_ = auVar59._4_4_ + auVar86._4_4_;
            auVar105._8_4_ = auVar59._8_4_ + auVar86._8_4_;
            auVar105._12_4_ = auVar59._12_4_ + auVar86._12_4_;
            auVar339._0_4_ = auVar133._0_4_ + auVar189._0_4_ + auVar133._0_4_ + auVar189._0_4_;
            auVar339._4_4_ = auVar133._4_4_ + auVar189._4_4_ + auVar133._4_4_ + auVar189._4_4_;
            auVar339._8_4_ = auVar133._8_4_ + auVar189._8_4_ + auVar133._8_4_ + auVar189._8_4_;
            auVar339._12_4_ = auVar133._12_4_ + auVar189._12_4_ + auVar133._12_4_ + auVar189._12_4_;
            auVar60._0_4_ = auVar34._0_4_ + auVar34._0_4_;
            auVar60._4_4_ = auVar34._4_4_ + auVar34._4_4_;
            auVar60._8_4_ = auVar34._8_4_ + auVar34._8_4_;
            auVar60._12_4_ = auVar34._12_4_ + auVar34._12_4_;
            auVar93 = ZEXT816(0) << 0x20;
            auVar248._0_4_ = auVar60._0_4_ * 0.0;
            auVar248._4_4_ = auVar60._4_4_ * 0.0;
            auVar248._8_4_ = auVar60._8_4_ * 0.0;
            auVar248._12_4_ = auVar60._12_4_ * 0.0;
            auVar86 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar339,auVar248);
            auVar264._0_4_ = auVar339._0_4_ + auVar248._0_4_;
            auVar264._4_4_ = auVar339._4_4_ + auVar248._4_4_;
            auVar264._8_4_ = auVar339._8_4_ + auVar248._8_4_;
            auVar264._12_4_ = auVar339._12_4_ + auVar248._12_4_;
            auVar34 = vfmadd213ps_fma(auVar339,auVar93,auVar60);
            auVar61._0_4_ = auVar151._0_4_ + auVar219._0_4_ + auVar151._0_4_ + auVar219._0_4_;
            auVar61._4_4_ = auVar151._4_4_ + auVar219._4_4_ + auVar151._4_4_ + auVar219._4_4_;
            auVar61._8_4_ = auVar151._8_4_ + auVar219._8_4_ + auVar151._8_4_ + auVar219._8_4_;
            auVar61._12_4_ = auVar151._12_4_ + auVar219._12_4_ + auVar151._12_4_ + auVar219._12_4_;
            auVar134._0_4_ = auVar61._0_4_ * 0.0;
            auVar134._4_4_ = auVar61._4_4_ * 0.0;
            auVar134._8_4_ = auVar61._8_4_ * 0.0;
            auVar134._12_4_ = auVar61._12_4_ * 0.0;
            auVar115 = vfmadd213ps_fma(ZEXT416(0) << 0x20,auVar289,auVar134);
            auVar285._0_4_ = auVar289._0_4_ + auVar134._0_4_;
            auVar285._4_4_ = auVar289._4_4_ + auVar134._4_4_;
            auVar285._8_4_ = auVar289._8_4_ + auVar134._8_4_;
            auVar285._12_4_ = auVar289._12_4_ + auVar134._12_4_;
            auVar289 = vfmadd213ps_fma(auVar289,auVar93,auVar61);
            local_338._0_4_ = auVar33._0_4_;
            local_338._4_4_ = auVar33._4_4_;
            uStack_330._0_4_ = auVar33._8_4_;
            uStack_330._4_4_ = auVar33._12_4_;
            auVar62._0_4_ = (float)local_338._0_4_ + (float)local_338._0_4_;
            auVar62._4_4_ = (float)local_338._4_4_ + (float)local_338._4_4_;
            auVar62._8_4_ = (float)uStack_330 + (float)uStack_330;
            auVar62._12_4_ = uStack_330._4_4_ + uStack_330._4_4_;
            auVar301._0_4_ = auVar62._0_4_ + auVar115._0_4_;
            auVar301._4_4_ = auVar62._4_4_ + auVar115._4_4_;
            auVar301._8_4_ = auVar62._8_4_ + auVar115._8_4_;
            auVar301._12_4_ = auVar62._12_4_ + auVar115._12_4_;
            auVar115 = vfmadd231ps_fma(auVar285,auVar62,auVar93);
            auVar335 = vfmadd231ps_fma(auVar289,auVar93,auVar62);
            auVar135._0_4_ = auVar273._0_4_ + auVar273._0_4_;
            auVar135._4_4_ = auVar273._4_4_ + auVar273._4_4_;
            auVar135._8_4_ = auVar273._8_4_ + auVar273._8_4_;
            auVar135._12_4_ = auVar273._12_4_ + auVar273._12_4_;
            auVar63._0_4_ = auVar105._0_4_ * 0.0;
            auVar63._4_4_ = auVar105._4_4_ * 0.0;
            auVar63._8_4_ = auVar105._8_4_ * 0.0;
            auVar63._12_4_ = auVar105._12_4_ * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar135,auVar63);
            auVar358._0_4_ = auVar135._0_4_ + auVar63._0_4_;
            auVar358._4_4_ = auVar135._4_4_ + auVar63._4_4_;
            auVar358._8_4_ = auVar135._8_4_ + auVar63._8_4_;
            auVar358._12_4_ = auVar135._12_4_ + auVar63._12_4_;
            auVar273 = vfmadd213ps_fma(auVar135,auVar93,auVar105);
            auVar106._0_4_ = auVar191._0_4_ + auVar150._0_4_ + auVar191._0_4_ + auVar150._0_4_;
            auVar106._4_4_ = auVar191._4_4_ + auVar150._4_4_ + auVar191._4_4_ + auVar150._4_4_;
            auVar106._8_4_ = auVar191._8_4_ + auVar150._8_4_ + auVar191._8_4_ + auVar150._8_4_;
            auVar106._12_4_ = auVar191._12_4_ + auVar150._12_4_ + auVar191._12_4_ + auVar150._12_4_;
            fVar251 = auVar106._0_4_ + auVar33._0_4_;
            fVar267 = auVar106._4_4_ + auVar33._4_4_;
            fVar269 = auVar106._8_4_ + auVar33._8_4_;
            fVar271 = auVar106._12_4_ + auVar33._12_4_;
            auVar289 = vfmadd231ps_fma(auVar358,auVar106,auVar93);
            auVar273 = vfmadd231ps_fma(auVar273,auVar93,auVar106);
            auVar92 = vfmadd231ps_fma(auVar264,auVar35,auVar93);
            auVar93 = vfmadd231ps_fma(auVar34,auVar93,auVar35);
            local_268._0_4_ = auVar71._0_4_;
            local_268._4_4_ = auVar71._4_4_;
            fStack_260 = auVar71._8_4_;
            fStack_25c = auVar71._12_4_;
            auVar347._0_4_ = fVar251 * 0.0;
            auVar347._4_4_ = fVar267 * 0.0;
            auVar347._8_4_ = fVar269 * 0.0;
            auVar347._12_4_ = fVar271 * 0.0;
            auVar33 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar301,auVar347);
            fVar154 = auVar289._0_4_;
            auVar265._0_4_ = fVar154 * 0.0;
            fVar194 = auVar289._4_4_;
            auVar265._4_4_ = fVar194 * 0.0;
            fVar195 = auVar289._8_4_;
            auVar265._8_4_ = fVar195 * 0.0;
            fVar196 = auVar289._12_4_;
            auVar265._12_4_ = fVar196 * 0.0;
            auVar34 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar115,auVar265);
            fVar23 = auVar273._0_4_;
            auVar107._0_4_ = fVar23 * 0.0;
            fVar65 = auVar273._4_4_;
            auVar107._4_4_ = fVar65 * 0.0;
            fVar66 = auVar273._8_4_;
            auVar107._8_4_ = fVar66 * 0.0;
            fVar67 = auVar273._12_4_;
            auVar107._12_4_ = fVar67 * 0.0;
            auVar273 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar335,auVar107);
            auVar71 = vfmadd231ps_fma(auVar347,auVar87,auVar301);
            auVar94 = vfmadd231ps_fma(auVar265,auVar87,auVar115);
            auVar289 = vfmadd213ps_fma(auVar87,auVar335,auVar107);
            local_318._0_4_ = auVar91._0_4_;
            local_318._4_4_ = auVar91._4_4_;
            fStack_310 = auVar91._8_4_;
            fStack_30c = auVar91._12_4_;
            auVar220._0_4_ = (float)local_318._0_4_ * fVar251;
            auVar220._4_4_ = (float)local_318._4_4_ * fVar267;
            auVar220._8_4_ = fStack_310 * fVar269;
            auVar220._12_4_ = fStack_30c * fVar271;
            auVar152._0_4_ = fVar154 * (float)local_318._0_4_;
            auVar152._4_4_ = fVar194 * (float)local_318._4_4_;
            auVar152._8_4_ = fVar195 * fStack_310;
            auVar152._12_4_ = fVar196 * fStack_30c;
            auVar359._0_4_ = (float)local_318._0_4_ * fVar23;
            auVar359._4_4_ = (float)local_318._4_4_ * fVar65;
            auVar359._8_4_ = fStack_310 * fVar66;
            auVar359._12_4_ = fStack_30c * fVar67;
            auVar87 = vfmadd231ps_fma(auVar220,auVar90,auVar301);
            auVar91 = vfmadd231ps_fma(auVar152,auVar90,auVar115);
            auVar90 = vfmadd231ps_fma(auVar359,auVar335,auVar90);
            local_2e8._0_4_ = auVar282._0_4_;
            local_2e8._4_4_ = auVar282._4_4_;
            uStack_2e0._0_4_ = auVar282._8_4_;
            uStack_2e0._4_4_ = auVar282._12_4_;
            auVar108._0_4_ = (float)local_2e8._0_4_ * fVar251;
            auVar108._4_4_ = (float)local_2e8._4_4_ * fVar267;
            auVar108._8_4_ = (float)uStack_2e0 * fVar269;
            auVar108._12_4_ = uStack_2e0._4_4_ * fVar271;
            auVar249._0_4_ = (float)local_2e8._0_4_ * fVar154;
            auVar249._4_4_ = (float)local_2e8._4_4_ * fVar194;
            auVar249._8_4_ = (float)uStack_2e0 * fVar195;
            auVar249._12_4_ = uStack_2e0._4_4_ * fVar196;
            auVar136._0_4_ = (float)local_2e8._0_4_ * fVar23;
            auVar136._4_4_ = (float)local_2e8._4_4_ * fVar65;
            auVar136._8_4_ = (float)uStack_2e0 * fVar66;
            auVar136._12_4_ = uStack_2e0._4_4_ * fVar67;
            auVar282 = vfmadd231ps_fma(auVar108,auVar215,auVar301);
            auVar115 = vfmadd231ps_fma(auVar249,auVar215,auVar115);
            auVar215 = vfmadd231ps_fma(auVar136,auVar215,auVar335);
            local_288 = auVar35._0_4_;
            fStack_284 = auVar35._4_4_;
            fStack_280 = auVar35._8_4_;
            fStack_27c = auVar35._12_4_;
            local_2f8._0_4_ = auVar86._0_4_;
            local_2f8._4_4_ = auVar86._4_4_;
            uStack_2f0._0_4_ = auVar86._8_4_;
            uStack_2f0._4_4_ = auVar86._12_4_;
            auVar192._0_4_ = local_288 + (float)local_2f8._0_4_;
            auVar192._4_4_ = fStack_284 + (float)local_2f8._4_4_;
            auVar192._8_4_ = fStack_280 + (float)uStack_2f0;
            auVar192._12_4_ = fStack_27c + uStack_2f0._4_4_;
            auVar33 = vfmadd231ps_fma(auVar33,auVar225,auVar192);
            auVar86 = vfmadd231ps_fma(auVar34,auVar225,auVar92);
            auVar34 = vfmadd231ps_fma(auVar273,auVar93,auVar225);
            auVar273 = vfmadd231ps_fma(auVar71,auVar24,auVar192);
            auVar35 = vfmadd231ps_fma(auVar94,auVar24,auVar92);
            auVar289 = vfmadd231ps_fma(auVar289,auVar93,auVar24);
            auVar225 = vfmadd231ps_fma(auVar87,auVar89,auVar192);
            auVar71 = vfmadd231ps_fma(auVar91,auVar89,auVar92);
            auVar24 = vfmadd231ps_fma(auVar90,auVar93,auVar89);
            auVar87 = vfmadd231ps_fma(auVar282,auVar148,auVar192);
            local_388._4_4_ = auVar87._4_4_ + auVar353._4_4_ + 0.0;
            local_388._0_4_ = auVar87._0_4_ + auVar353._0_4_ + 0.0;
            fStack_380 = auVar87._8_4_ + auVar353._8_4_ + 0.0;
            fStack_37c = auVar87._12_4_ + auVar353._12_4_ + 0.0;
            auVar115 = vfmadd231ps_fma(auVar115,auVar148,auVar92);
            local_378._4_4_ = auVar115._4_4_ + (float)local_268._4_4_ + 0.0;
            local_378._0_4_ = auVar115._0_4_ + (float)local_268._0_4_ + 0.0;
            fStack_370 = auVar115._8_4_ + fStack_260 + 0.0;
            fStack_36c = auVar115._12_4_ + fStack_25c + 0.0;
            auVar115 = vfmadd231ps_fma(auVar215,auVar148,auVar93);
            fVar23 = auVar115._0_4_ + auVar88._0_4_ + 0.0;
            fVar65 = auVar115._4_4_ + auVar88._4_4_ + 0.0;
            fVar66 = auVar115._8_4_ + auVar88._8_4_ + 0.0;
            fVar67 = auVar115._12_4_ + auVar88._12_4_ + 0.0;
            auVar64._0_4_ = auVar289._0_4_ * auVar71._0_4_;
            auVar64._4_4_ = auVar289._4_4_ * auVar71._4_4_;
            auVar64._8_4_ = auVar289._8_4_ * auVar71._8_4_;
            auVar64._12_4_ = auVar289._12_4_ * auVar71._12_4_;
            auVar115 = vfmsub231ps_fma(auVar64,auVar35,auVar24);
            auVar193._0_4_ = auVar24._0_4_ * auVar273._0_4_;
            auVar193._4_4_ = auVar24._4_4_ * auVar273._4_4_;
            auVar193._8_4_ = auVar24._8_4_ * auVar273._8_4_;
            auVar193._12_4_ = auVar24._12_4_ * auVar273._12_4_;
            auVar353 = vfmsub231ps_fma(auVar193,auVar289,auVar225);
            auVar250._0_4_ = auVar35._0_4_ * auVar225._0_4_;
            auVar250._4_4_ = auVar35._4_4_ * auVar225._4_4_;
            auVar250._8_4_ = auVar35._8_4_ * auVar225._8_4_;
            auVar250._12_4_ = auVar35._12_4_ * auVar225._12_4_;
            auVar87 = vfmsub231ps_fma(auVar250,auVar273,auVar71);
            fVar251 = auVar34._0_4_;
            auVar340._0_4_ = fVar251 * auVar225._0_4_;
            fVar267 = auVar34._4_4_;
            auVar340._4_4_ = fVar267 * auVar225._4_4_;
            fVar269 = auVar34._8_4_;
            auVar340._8_4_ = fVar269 * auVar225._8_4_;
            fVar271 = auVar34._12_4_;
            auVar340._12_4_ = fVar271 * auVar225._12_4_;
            auVar88 = vfmsub231ps_fma(auVar340,auVar33,auVar24);
            auVar137._0_4_ = auVar86._0_4_ * auVar24._0_4_;
            auVar137._4_4_ = auVar86._4_4_ * auVar24._4_4_;
            auVar137._8_4_ = auVar86._8_4_ * auVar24._8_4_;
            auVar137._12_4_ = auVar86._12_4_ * auVar24._12_4_;
            auVar24 = vfmsub231ps_fma(auVar137,auVar71,auVar34);
            auVar302._0_4_ = auVar33._0_4_ * auVar71._0_4_;
            auVar302._4_4_ = auVar33._4_4_ * auVar71._4_4_;
            auVar302._8_4_ = auVar33._8_4_ * auVar71._8_4_;
            auVar302._12_4_ = auVar33._12_4_ * auVar71._12_4_;
            auVar225 = vfmsub231ps_fma(auVar302,auVar86,auVar225);
            auVar153._0_4_ = auVar35._0_4_ * fVar251;
            auVar153._4_4_ = auVar35._4_4_ * fVar267;
            auVar153._8_4_ = auVar35._8_4_ * fVar269;
            auVar153._12_4_ = auVar35._12_4_ * fVar271;
            auVar71 = vfmsub231ps_fma(auVar153,auVar86,auVar289);
            auVar286._0_4_ = auVar289._0_4_ * auVar33._0_4_;
            auVar286._4_4_ = auVar289._4_4_ * auVar33._4_4_;
            auVar286._8_4_ = auVar289._8_4_ * auVar33._8_4_;
            auVar286._12_4_ = auVar289._12_4_ * auVar33._12_4_;
            auVar34 = vfmsub231ps_fma(auVar286,auVar34,auVar273);
            auVar348._0_4_ = auVar273._0_4_ * auVar86._0_4_;
            auVar348._4_4_ = auVar273._4_4_ * auVar86._4_4_;
            auVar348._8_4_ = auVar273._8_4_ * auVar86._8_4_;
            auVar348._12_4_ = auVar273._12_4_ * auVar86._12_4_;
            auVar89 = vfmsub231ps_fma(auVar348,auVar33,auVar35);
            auVar235._0_4_ = fVar251 * auVar87._0_4_;
            auVar235._4_4_ = fVar267 * auVar87._4_4_;
            auVar235._8_4_ = fVar269 * auVar87._8_4_;
            auVar235._12_4_ = fVar271 * auVar87._12_4_;
            auVar86 = vfmadd231ps_fma(auVar235,auVar353,auVar86);
            auVar273 = vfmadd231ps_fma(auVar86,auVar115,auVar33);
            auVar33 = vdivps_avx(auVar115,auVar273);
            auVar289 = vdivps_avx(auVar24,auVar273);
            auVar115 = vdivps_avx(auVar71,auVar273);
            auVar86 = vdivps_avx(auVar353,auVar273);
            _local_358 = vdivps_avx(auVar88,auVar273);
            _local_368 = vdivps_avx(auVar34,auVar273);
            auVar34 = vdivps_avx(auVar87,auVar273);
            auVar35 = vdivps_avx(auVar225,auVar273);
            auVar273 = vdivps_avx(auVar89,auVar273);
            auVar287._0_4_ = fVar23 * auVar34._0_4_;
            auVar287._4_4_ = fVar65 * auVar34._4_4_;
            auVar287._8_4_ = fVar66 * auVar34._8_4_;
            auVar287._12_4_ = fVar67 * auVar34._12_4_;
            auVar303._0_4_ = fVar23 * auVar35._0_4_;
            auVar303._4_4_ = fVar65 * auVar35._4_4_;
            auVar303._8_4_ = fVar66 * auVar35._8_4_;
            auVar303._12_4_ = fVar67 * auVar35._12_4_;
            auVar341._0_4_ = fVar23 * auVar273._0_4_;
            auVar341._4_4_ = fVar65 * auVar273._4_4_;
            auVar341._8_4_ = fVar66 * auVar273._8_4_;
            auVar341._12_4_ = fVar67 * auVar273._12_4_;
            auVar353 = vfmadd231ps_fma(auVar287,_local_378,auVar86);
            auVar225 = vfmadd231ps_fma(auVar303,_local_378,_local_358);
            auVar71 = vfmadd231ps_fma(auVar341,_local_368,_local_378);
            auVar353 = vfmadd231ps_fma(auVar353,_local_388,auVar33);
          }
          auVar225 = vfmadd231ps_fma(auVar225,_local_388,auVar289);
          auVar71 = vfmadd231ps_fma(auVar71,auVar115,_local_388);
          auVar306._0_8_ = auVar353._0_8_ ^ 0x8000000080000000;
          auVar306._8_4_ = auVar353._8_4_ ^ 0x80000000;
          auVar306._12_4_ = auVar353._12_4_ ^ 0x80000000;
          auVar291._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
          auVar291._8_4_ = auVar225._8_4_ ^ 0x80000000;
          auVar291._12_4_ = auVar225._12_4_ ^ 0x80000000;
          auVar276._0_8_ = auVar71._0_8_ ^ 0x8000000080000000;
          auVar276._8_4_ = auVar71._8_4_ ^ 0x80000000;
          auVar276._12_4_ = auVar71._12_4_ ^ 0x80000000;
          _local_388 = auVar115;
          _local_378 = auVar289;
        }
        else {
          fVar23 = (pGVar16->time_range).lower;
          auVar25._4_4_ = fVar23;
          auVar25._0_4_ = fVar23;
          auVar25._8_4_ = fVar23;
          auVar25._12_4_ = fVar23;
          fVar65 = pGVar16->fnumTimeSegments;
          auVar88 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar25);
          fVar23 = (pGVar16->time_range).upper - fVar23;
          auVar26._4_4_ = fVar23;
          auVar26._0_4_ = fVar23;
          auVar26._8_4_ = fVar23;
          auVar26._12_4_ = fVar23;
          auVar87 = vdivps_avx(auVar88,auVar26);
          auVar27._0_4_ = fVar65 * auVar87._0_4_;
          auVar27._4_4_ = fVar65 * auVar87._4_4_;
          auVar27._8_4_ = fVar65 * auVar87._8_4_;
          auVar27._12_4_ = fVar65 * auVar87._12_4_;
          auVar87 = vroundps_avx(auVar27,1);
          fVar65 = fVar65 + -1.0;
          auVar109._4_4_ = fVar65;
          auVar109._0_4_ = fVar65;
          auVar109._8_4_ = fVar65;
          auVar109._12_4_ = fVar65;
          auVar87 = vminps_avx(auVar87,auVar109);
          auVar87 = vmaxps_avx(auVar87,ZEXT416(0) << 0x20);
          auVar89 = vsubps_avx(auVar27,auVar87);
          local_98 = vcvtps2dq_avx(auVar87);
          uVar3 = 0;
          for (uVar19 = uVar17 & 0xff; (uVar19 & 1) == 0; uVar19 = uVar19 >> 1 | 0x80000000) {
            uVar3 = uVar3 + 1;
          }
          iVar4 = *(int *)(local_98 + (ulong)uVar3 * 4);
          auVar28._4_4_ = iVar4;
          auVar28._0_4_ = iVar4;
          auVar28._8_4_ = iVar4;
          auVar28._12_4_ = iVar4;
          auVar90 = vpcmpeqd_avx(local_98,auVar28);
          auVar91 = auVar24 & ~auVar90;
          if ((((auVar91 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
               (auVar91 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar91 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              -1 < auVar91[0xf]) {
            lVar6 = *(long *)&pGVar16[1].fnumTimeSegments;
            lVar20 = (long)iVar4 * 0x38;
            plVar2 = (long *)(lVar6 + lVar20);
            iVar4 = *(int *)(lVar6 + 0x20 + lVar20);
            if (iVar4 == 0x9134) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              uVar3 = *(uint *)(lVar18 + 0xc + lVar21);
              auVar86 = ZEXT416(uVar3);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x10 + lVar21)),0x1c);
              auVar90 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar21)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x14 + lVar21)),0x1c);
              auVar87 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),0x28);
              auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),
                                      ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),0x1c);
              auVar33 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar21)),0x28);
              auVar273 = vinsertps_avx(ZEXT416(uVar3),ZEXT416(*(uint *)(lVar18 + 0x1c + lVar21)),
                                       0x1c);
              auVar88 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar21)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar29._8_8_ = 0;
              auVar29._0_8_ = *(ulong *)(lVar18 + 4 + lVar21);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar29,0x4c);
              auVar90 = vshufps_avx(auVar33,auVar33,0x78);
              auVar110._8_8_ = 0;
              auVar110._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),auVar110,0x4c);
              auVar87 = vshufps_avx(auVar33,auVar33,0x78);
              auVar138._8_8_ = 0;
              auVar138._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
              auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar138,0x4c);
              auVar33 = vshufps_avx(auVar33,auVar33,0x78);
              auVar139._8_8_ = 0;
              auVar139._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar21);
              uVar3 = *(uint *)(lVar18 + 0x24 + lVar21);
              auVar86 = ZEXT416(uVar3);
              auVar273 = vshufps_avx(ZEXT416(uVar3),auVar139,0x4c);
              auVar88 = vshufps_avx(auVar273,auVar273,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar30._8_8_ = 0;
              auVar30._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
              auVar33 = vinsertps_avx(auVar30,ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),0x20);
              auVar31._8_8_ = 0;
              auVar31._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar21);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar31);
              auVar273 = vshufps_avx(auVar86,auVar31,0xd8);
              auVar197._8_8_ = 0;
              auVar197._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar197);
              auVar35 = vshufps_avx(auVar86,auVar197,0xd8);
              fVar23 = *(float *)(lVar18 + 0x24 + lVar21);
              fVar65 = *(float *)(lVar18 + 0x28 + lVar21);
              fVar66 = *(float *)(lVar18 + 0x2c + lVar21);
              fVar67 = *(float *)(lVar18 + 0x30 + lVar21);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar23),
                                        ZEXT416((uint)fVar23));
              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
              auVar289 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
              auVar86 = vrsqrtss_avx(auVar289,auVar289);
              fVar251 = auVar86._0_4_;
              local_98 = ZEXT416((uint)(fVar251 * 1.5));
              fVar251 = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar289._0_4_ * -0.5;
              auVar88 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar251 * fVar23)),0x30);
              auVar90 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar251 * fVar65)),0x30);
              auVar86 = ZEXT416((uint)(fVar251 * fVar66));
              auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                       ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),0x10);
              auVar33 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar67 * fVar251)),0x30);
              auVar273 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar21)),0x20);
              auVar87 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar251 * fVar66)),0x30);
            }
            else if (iVar4 == 0x9244) {
              lVar18 = *plVar2;
              lVar21 = plVar2[2] * uVar14;
              auVar90 = *(undefined1 (*) [16])(lVar18 + lVar21);
              auVar87 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar21);
              auVar33 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar21);
              auVar88 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar21);
            }
            iVar4 = *(int *)(lVar6 + 0x58 + lVar20);
            if (iVar4 == 0x9134) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x10 + lVar20)),0x1c);
              auVar86 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar6 + 0x20 + lVar20)),0x28);
              auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 4 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x14 + lVar20)),0x1c);
              local_98 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar6 + 0x24 + lVar20)),0x28);
              auVar34 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 8 + lVar20)),
                                      ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),0x1c);
              auVar34 = vinsertps_avx(auVar34,ZEXT416(*(uint *)(lVar6 + 0x28 + lVar20)),0x28);
              auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),
                                       ZEXT416(*(uint *)(lVar6 + 0x1c + lVar20)),0x1c);
              auVar24 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar6 + 0x2c + lVar20)),0x28);
            }
            else if (iVar4 == 0x9234) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar198._8_8_ = 0;
              auVar198._0_8_ = *(ulong *)(lVar6 + 4 + lVar20);
              auVar86 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),auVar198,0x4c);
              auVar86 = vshufps_avx(auVar86,auVar86,0x78);
              auVar222._8_8_ = 0;
              auVar222._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar20);
              auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),auVar222,0x4c);
              local_98 = vshufps_avx(auVar34,auVar34,0x78);
              auVar223._8_8_ = 0;
              auVar223._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar20);
              auVar34 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),auVar223,0x4c);
              auVar34 = vshufps_avx(auVar34,auVar34,0x78);
              auVar224._8_8_ = 0;
              auVar224._0_8_ = *(ulong *)(lVar6 + 0x28 + lVar20);
              auVar273 = vshufps_avx(ZEXT416(*(uint *)(lVar6 + 0x24 + lVar20)),auVar224,0x4c);
              auVar24 = vshufps_avx(auVar273,auVar273,0x78);
            }
            else if (iVar4 == 0xb001) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar199._8_8_ = 0;
              auVar199._0_8_ = *(ulong *)(lVar6 + 0x10 + lVar20);
              auVar34 = vinsertps_avx(auVar199,ZEXT416(*(uint *)(lVar6 + 8 + lVar20)),0x20);
              auVar200._8_8_ = 0;
              auVar200._0_8_ = *(ulong *)(lVar6 + 0x34 + lVar20);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + lVar20)),auVar200);
              auVar273 = vshufps_avx(auVar86,auVar200,0xd8);
              auVar272._8_8_ = 0;
              auVar272._0_8_ = *(ulong *)(lVar6 + 0x1c + lVar20);
              auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar6 + 0x18 + lVar20)),auVar272);
              auVar35 = vshufps_avx(auVar86,auVar272,0xd8);
              fVar23 = *(float *)(lVar6 + 0x24 + lVar20);
              fVar65 = *(float *)(lVar6 + 0x28 + lVar20);
              fVar66 = *(float *)(lVar6 + 0x2c + lVar20);
              fVar67 = *(float *)(lVar6 + 0x30 + lVar20);
              auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar23),
                                        ZEXT416((uint)fVar23));
              auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
              auVar289 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
              auVar86 = vrsqrtss_avx(auVar289,auVar289);
              fVar251 = auVar86._0_4_;
              fVar251 = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar289._0_4_ * -0.5;
              auVar24 = vinsertps_avx(auVar35,ZEXT416((uint)(fVar23 * fVar251)),0x30);
              auVar86 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar65 * fVar251)),0x30);
              auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar6 + 0xc + lVar20)),
                                       ZEXT416(*(uint *)(lVar6 + 4 + lVar20)),0x10);
              auVar34 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar67 * fVar251)),0x30);
              auVar273 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar6 + 0x3c + lVar20)),0x20);
              local_98 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar66 * fVar251)),0x30);
            }
            else if (iVar4 == 0x9244) {
              lVar6 = plVar2[7];
              lVar20 = uVar14 * plVar2[9];
              auVar86 = *(undefined1 (*) [16])(lVar6 + lVar20);
              local_98 = *(undefined1 (*) [16])(lVar6 + 0x10 + lVar20);
              auVar34 = *(undefined1 (*) [16])(lVar6 + 0x20 + lVar20);
              auVar24 = *(undefined1 (*) [16])(lVar6 + 0x30 + lVar20);
            }
            uVar22 = auVar90._0_4_;
            auVar273._4_4_ = uVar22;
            auVar273._0_4_ = uVar22;
            auVar273._8_4_ = uVar22;
            auVar273._12_4_ = uVar22;
            auVar35 = vshufps_avx(auVar90,auVar90,0x55);
            _local_388 = vshufps_avx(auVar90,auVar90,0xaa);
            local_378._4_4_ = auVar87._0_4_;
            local_378._0_4_ = local_378._4_4_;
            fStack_370 = (float)local_378._4_4_;
            fStack_36c = (float)local_378._4_4_;
            _local_2d8 = vshufps_avx(auVar87,auVar87,0x55);
            _local_328 = vshufps_avx(auVar87,auVar87,0xaa);
            local_368._4_4_ = auVar33._0_4_;
            local_368._0_4_ = local_368._4_4_;
            fStack_360 = (float)local_368._4_4_;
            fStack_35c = (float)local_368._4_4_;
            _local_308 = vshufps_avx(auVar33,auVar33,0x55);
            _local_358 = vshufps_avx(auVar33,auVar33,0xaa);
            local_338._4_4_ = auVar88._0_4_;
            local_338._0_4_ = local_338._4_4_;
            uStack_330._0_4_ = (float)local_338._4_4_;
            uStack_330._4_4_ = (float)local_338._4_4_;
            _local_2e8 = vshufps_avx(auVar88,auVar88,0x55);
            _local_348 = vshufps_avx(auVar88,auVar88,0xaa);
            uVar22 = auVar86._0_4_;
            auVar289._4_4_ = uVar22;
            auVar289._0_4_ = uVar22;
            auVar289._8_4_ = uVar22;
            auVar289._12_4_ = uVar22;
            auVar115 = vshufps_avx(auVar86,auVar86,0x55);
            auVar33 = vshufps_avx(auVar86,auVar86,0xaa);
            uVar22 = local_98._0_4_;
            auVar225._4_4_ = uVar22;
            auVar225._0_4_ = uVar22;
            auVar225._8_4_ = uVar22;
            auVar225._12_4_ = uVar22;
            auVar88 = vshufps_avx(local_98,local_98,0x55);
            auVar86 = vshufps_avx(local_98,local_98,0xaa);
            uVar22 = auVar34._0_4_;
            auVar353._4_4_ = uVar22;
            auVar353._0_4_ = uVar22;
            auVar353._8_4_ = uVar22;
            auVar353._12_4_ = uVar22;
            auVar87 = vshufps_avx(auVar34,auVar34,0x55);
            auVar34 = vshufps_avx(auVar34,auVar34,0xaa);
            local_2f8._4_4_ = auVar24._0_4_;
            local_2f8._0_4_ = local_2f8._4_4_;
            uStack_2f0._0_4_ = (float)local_2f8._4_4_;
            uStack_2f0._4_4_ = (float)local_2f8._4_4_;
            auVar71 = vshufps_avx(auVar24,auVar24,0x55);
            auVar90 = vshufps_avx(auVar24,auVar24,0xaa);
          }
          else if (uVar17 != 0) {
            lVar6 = *(long *)&pGVar16[1].fnumTimeSegments;
            _local_318 = auVar24;
            do {
              uVar3 = 0;
              for (uVar17 = uVar17 & 0xff; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
                uVar3 = uVar3 + 1;
              }
              iVar4 = *(int *)(local_98 + (ulong)uVar3 * 4);
              auVar312._4_4_ = iVar4;
              auVar312._0_4_ = iVar4;
              auVar312._8_4_ = iVar4;
              auVar312._12_4_ = iVar4;
              auVar33 = vpcmpeqd_avx(auVar312,local_98);
              auVar24 = vpand_avx(auVar33,_local_318);
              lVar20 = (long)iVar4 * 0x38;
              plVar2 = (long *)(lVar6 + lVar20);
              iVar4 = *(int *)(lVar6 + 0x20 + lVar20);
              if (iVar4 == 0x9134) {
                lVar18 = *plVar2;
                lVar21 = plVar2[2] * uVar14;
                auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),
                                        ZEXT416(*(uint *)(lVar18 + 0x10 + lVar21)),0x1c);
                local_48 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x20 + lVar21)),0x28);
                auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),
                                        ZEXT416(*(uint *)(lVar18 + 0x14 + lVar21)),0x1c);
                local_58 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),0x28);
                auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),
                                        ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),0x1c);
                local_78 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x28 + lVar21)),0x28);
                auVar33 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                        ZEXT416(*(uint *)(lVar18 + 0x1c + lVar21)),0x1c);
                local_68 = vinsertps_avx(auVar33,ZEXT416(*(uint *)(lVar18 + 0x2c + lVar21)),0x28);
              }
              else if (iVar4 == 0x9234) {
                lVar18 = *plVar2;
                lVar21 = plVar2[2] * uVar14;
                auVar313._8_8_ = 0;
                auVar313._0_8_ = *(ulong *)(lVar18 + 4 + lVar21);
                auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar313,0x4c);
                local_48 = vshufps_avx(auVar33,auVar33,0x78);
                auVar314._8_8_ = 0;
                auVar314._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
                auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),auVar314,0x4c);
                local_58 = vshufps_avx(auVar33,auVar33,0x78);
                auVar315._8_8_ = 0;
                auVar315._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
                auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar315,0x4c);
                local_78 = vshufps_avx(auVar33,auVar33,0x78);
                auVar316._8_8_ = 0;
                auVar316._0_8_ = *(ulong *)(lVar18 + 0x28 + lVar21);
                auVar33 = vshufps_avx(ZEXT416(*(uint *)(lVar18 + 0x24 + lVar21)),auVar316,0x4c);
                local_68 = vshufps_avx(auVar33,auVar33,0x78);
              }
              else if (iVar4 == 0xb001) {
                lVar18 = *plVar2;
                lVar21 = plVar2[2] * uVar14;
                auVar317._8_8_ = 0;
                auVar317._0_8_ = *(ulong *)(lVar18 + 0x10 + lVar21);
                auVar33 = vinsertps_avx(auVar317,ZEXT416(*(uint *)(lVar18 + 8 + lVar21)),0x20);
                auVar318._8_8_ = 0;
                auVar318._0_8_ = *(ulong *)(lVar18 + 0x34 + lVar21);
                auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + lVar21)),auVar318);
                auVar34 = vshufps_avx(auVar86,auVar318,0xd8);
                auVar319._8_8_ = 0;
                auVar319._0_8_ = *(ulong *)(lVar18 + 0x1c + lVar21);
                auVar86 = vmovlhps_avx(ZEXT416(*(uint *)(lVar18 + 0x18 + lVar21)),auVar319);
                auVar273 = vshufps_avx(auVar86,auVar319,0xd8);
                fVar23 = *(float *)(lVar18 + 0x24 + lVar21);
                fVar65 = *(float *)(lVar18 + 0x28 + lVar21);
                fVar66 = *(float *)(lVar18 + 0x2c + lVar21);
                fVar67 = *(float *)(lVar18 + 0x30 + lVar21);
                auVar86 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar23),
                                          ZEXT416((uint)fVar23));
                auVar86 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
                auVar35 = vfmadd231ss_fma(auVar86,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
                auVar86 = vrsqrtss_avx(auVar35,auVar35);
                fVar251 = auVar86._0_4_;
                fVar251 = fVar251 * 1.5 + fVar251 * fVar251 * fVar251 * auVar35._0_4_ * -0.5;
                local_68 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar251 * fVar23)),0x30);
                local_48 = vinsertps_avx(auVar34,ZEXT416((uint)(fVar251 * fVar65)),0x30);
                auVar86 = vinsertps_avx(ZEXT416(*(uint *)(lVar18 + 0xc + lVar21)),
                                        ZEXT416(*(uint *)(lVar18 + 4 + lVar21)),0x10);
                local_78 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar67 * fVar251)),0x30);
                auVar33 = vinsertps_avx(auVar86,ZEXT416(*(uint *)(lVar18 + 0x3c + lVar21)),0x20);
                local_58 = vinsertps_avx(auVar33,ZEXT416((uint)(fVar251 * fVar66)),0x30);
              }
              else if (iVar4 == 0x9244) {
                lVar18 = *plVar2;
                lVar21 = plVar2[2] * uVar14;
                local_48 = *(undefined1 (*) [16])(lVar18 + lVar21);
                local_58 = *(undefined1 (*) [16])(lVar18 + 0x10 + lVar21);
                local_78 = *(undefined1 (*) [16])(lVar18 + 0x20 + lVar21);
                local_68 = *(undefined1 (*) [16])(lVar18 + 0x30 + lVar21);
              }
              _local_318 = _local_318 ^ auVar24;
              uVar22 = local_48._0_4_;
              auVar33 = vshufps_avx(local_48,local_48,0x55);
              auVar86 = vshufps_avx(local_48,local_48,0xaa);
              local_a8._4_4_ = local_58._0_4_;
              local_a8._0_4_ = local_a8._4_4_;
              fStack_a0 = (float)local_a8._4_4_;
              fStack_9c = (float)local_a8._4_4_;
              auVar34 = vshufps_avx(local_58,local_58,0x55);
              auVar289 = vshufps_avx(local_58,local_58,0xaa);
              local_d8._4_4_ = local_78._0_4_;
              auVar115 = vshufps_avx(local_78,local_78,0x55);
              auVar225 = vshufps_avx(local_78,local_78,0xaa);
              local_1e8._4_4_ = local_68._0_4_;
              auVar353 = vshufps_avx(local_68,local_68,0x55);
              auVar71 = vshufps_avx(local_68,local_68,0xaa);
              iVar4 = *(int *)(lVar6 + 0x58 + lVar20);
              local_d8._0_4_ = local_d8._4_4_;
              local_d8._8_4_ = local_d8._4_4_;
              local_d8._12_4_ = local_d8._4_4_;
              local_1e8._0_4_ = local_1e8._4_4_;
              local_1e8._8_4_ = local_1e8._4_4_;
              local_1e8._12_4_ = local_1e8._4_4_;
              if (iVar4 == 0x9134) {
                lVar20 = plVar2[7];
                lVar18 = plVar2[9] * uVar14;
                auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),
                                         ZEXT416(*(uint *)(lVar20 + 0x10 + lVar18)),0x1c);
                local_148 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar20 + 0x20 + lVar18)),0x28);
                auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 4 + lVar18)),
                                         ZEXT416(*(uint *)(lVar20 + 0x14 + lVar18)),0x1c);
                local_158 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar20 + 0x24 + lVar18)),0x28);
                auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 8 + lVar18)),
                                         ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),0x1c);
                local_178 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar20 + 0x28 + lVar18)),0x28);
                auVar273 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),
                                         ZEXT416(*(uint *)(lVar20 + 0x1c + lVar18)),0x1c);
                local_168 = vinsertps_avx(auVar273,ZEXT416(*(uint *)(lVar20 + 0x2c + lVar18)),0x28);
LAB_006fdceb:
                auVar203._4_4_ = uVar22;
                auVar203._0_4_ = uVar22;
                auVar203._8_4_ = uVar22;
                auVar203._12_4_ = uVar22;
              }
              else {
                if (iVar4 == 0x9234) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  auVar320._8_8_ = 0;
                  auVar320._0_8_ = *(ulong *)(lVar20 + 4 + lVar18);
                  auVar273 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),auVar320,0x4c);
                  local_148 = vshufps_avx(auVar273,auVar273,0x78);
                  auVar321._8_8_ = 0;
                  auVar321._0_8_ = *(ulong *)(lVar20 + 0x10 + lVar18);
                  auVar273 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),auVar321,0x4c);
                  local_158 = vshufps_avx(auVar273,auVar273,0x78);
                  auVar322._8_8_ = 0;
                  auVar322._0_8_ = *(ulong *)(lVar20 + 0x1c + lVar18);
                  auVar273 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),auVar322,0x4c);
                  local_178 = vshufps_avx(auVar273,auVar273,0x78);
                  auVar323._8_8_ = 0;
                  auVar323._0_8_ = *(ulong *)(lVar20 + 0x28 + lVar18);
                  auVar273 = vshufps_avx(ZEXT416(*(uint *)(lVar20 + 0x24 + lVar18)),auVar323,0x4c);
                  local_168 = vshufps_avx(auVar273,auVar273,0x78);
                  goto LAB_006fdceb;
                }
                if (iVar4 == 0xb001) {
                  lVar20 = plVar2[7];
                  lVar18 = plVar2[9] * uVar14;
                  auVar324._8_8_ = 0;
                  auVar324._0_8_ = *(ulong *)(lVar20 + 0x10 + lVar18);
                  auVar273 = vinsertps_avx(auVar324,ZEXT416(*(uint *)(lVar20 + 8 + lVar18)),0x20);
                  auVar325._8_8_ = 0;
                  auVar325._0_8_ = *(ulong *)(lVar20 + 0x34 + lVar18);
                  auVar35 = vmovlhps_avx(ZEXT416(*(uint *)(lVar20 + lVar18)),auVar325);
                  auVar91 = vshufps_avx(auVar35,auVar325,0xd8);
                  auVar326._8_8_ = 0;
                  auVar326._0_8_ = *(ulong *)(lVar20 + 0x1c + lVar18);
                  auVar35 = vmovlhps_avx(ZEXT416(*(uint *)(lVar20 + 0x18 + lVar18)),auVar326);
                  auVar148 = vshufps_avx(auVar35,auVar326,0xd8);
                  fVar23 = *(float *)(lVar20 + 0x24 + lVar18);
                  fVar65 = *(float *)(lVar20 + 0x28 + lVar18);
                  fVar66 = *(float *)(lVar20 + 0x2c + lVar18);
                  fVar67 = *(float *)(lVar20 + 0x30 + lVar18);
                  auVar35 = vfmadd231ss_fma(ZEXT416((uint)(fVar65 * fVar65)),ZEXT416((uint)fVar23),
                                            ZEXT416((uint)fVar23));
                  auVar35 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar66),ZEXT416((uint)fVar66));
                  auVar215 = vfmadd231ss_fma(auVar35,ZEXT416((uint)fVar67),ZEXT416((uint)fVar67));
                  auVar35 = vrsqrtss_avx(auVar215,auVar215);
                  fVar251 = auVar35._0_4_;
                  fVar251 = fVar251 * fVar251 * fVar251 * auVar215._0_4_ * -0.5 + fVar251 * 1.5;
                  local_168 = vinsertps_avx(auVar148,ZEXT416((uint)(fVar251 * fVar23)),0x30);
                  local_148 = vinsertps_avx(auVar91,ZEXT416((uint)(fVar251 * fVar65)),0x30);
                  auVar35 = vinsertps_avx(ZEXT416(*(uint *)(lVar20 + 0xc + lVar18)),
                                          ZEXT416(*(uint *)(lVar20 + 4 + lVar18)),0x10);
                  local_178 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar251 * fVar67)),0x30);
                  auVar273 = vinsertps_avx(auVar35,ZEXT416(*(uint *)(lVar20 + 0x3c + lVar18)),0x20);
                  local_158 = vinsertps_avx(auVar273,ZEXT416((uint)(fVar66 * fVar251)),0x30);
                  auVar203._4_4_ = uVar22;
                  auVar203._0_4_ = uVar22;
                  auVar203._8_4_ = uVar22;
                  auVar203._12_4_ = uVar22;
                }
                else {
                  auVar203._4_4_ = uVar22;
                  auVar203._0_4_ = uVar22;
                  auVar203._8_4_ = uVar22;
                  auVar203._12_4_ = uVar22;
                  if (iVar4 == 0x9244) {
                    lVar20 = plVar2[7];
                    lVar18 = plVar2[9] * uVar14;
                    local_148 = *(undefined1 (*) [16])(lVar20 + lVar18);
                    local_158 = *(undefined1 (*) [16])(lVar20 + 0x10 + lVar18);
                    local_178 = *(undefined1 (*) [16])(lVar20 + 0x20 + lVar18);
                    local_168 = *(undefined1 (*) [16])(lVar20 + 0x30 + lVar18);
                  }
                }
              }
              auVar273 = vblendvps_avx(in_ZMM9._0_16_,auVar203,auVar24);
              in_ZMM9 = ZEXT1664(auVar273);
              auVar35 = vblendvps_avx(in_ZMM8._0_16_,auVar33,auVar24);
              in_ZMM8 = ZEXT1664(auVar35);
              _local_388 = vblendvps_avx(_local_388,auVar86,auVar24);
              _local_378 = vblendvps_avx(_local_378,_local_a8,auVar24);
              _local_2d8 = vblendvps_avx(_local_2d8,auVar34,auVar24);
              _local_328 = vblendvps_avx(_local_328,auVar289,auVar24);
              _local_368 = vblendvps_avx(_local_368,local_d8,auVar24);
              _local_308 = vblendvps_avx(_local_308,auVar115,auVar24);
              _local_358 = vblendvps_avx(_local_358,auVar225,auVar24);
              _local_338 = vblendvps_avx(_local_338,local_1e8,auVar24);
              _local_2e8 = vblendvps_avx(_local_2e8,auVar353,auVar24);
              _local_348 = vblendvps_avx(_local_348,auVar71,auVar24);
              uVar22 = local_148._0_4_;
              auVar327._4_4_ = uVar22;
              auVar327._0_4_ = uVar22;
              auVar327._8_4_ = uVar22;
              auVar327._12_4_ = uVar22;
              auVar289 = vblendvps_avx(in_ZMM10._0_16_,auVar327,auVar24);
              in_ZMM10 = ZEXT1664(auVar289);
              auVar33 = vshufps_avx(local_148,local_148,0x55);
              auVar115 = vblendvps_avx(in_ZMM7._0_16_,auVar33,auVar24);
              in_ZMM7 = ZEXT1664(auVar115);
              auVar33 = vshufps_avx(local_148,local_148,0xaa);
              auVar33 = vblendvps_avx(in_ZMM4._0_16_,auVar33,auVar24);
              in_ZMM4 = ZEXT1664(auVar33);
              uVar22 = local_158._0_4_;
              auVar328._4_4_ = uVar22;
              auVar328._0_4_ = uVar22;
              auVar328._8_4_ = uVar22;
              auVar328._12_4_ = uVar22;
              auVar225 = vblendvps_avx(in_ZMM6._0_16_,auVar328,auVar24);
              in_ZMM6 = ZEXT1664(auVar225);
              auVar86 = vshufps_avx(local_158,local_158,0x55);
              auVar88 = vblendvps_avx(auVar88,auVar86,auVar24);
              auVar86 = vshufps_avx(local_158,local_158,0xaa);
              auVar86 = vblendvps_avx(in_ZMM5._0_16_,auVar86,auVar24);
              in_ZMM5 = ZEXT1664(auVar86);
              uVar22 = local_178._0_4_;
              auVar329._4_4_ = uVar22;
              auVar329._0_4_ = uVar22;
              auVar329._8_4_ = uVar22;
              auVar329._12_4_ = uVar22;
              auVar353 = vblendvps_avx(in_ZMM15._0_16_,auVar329,auVar24);
              in_ZMM15 = ZEXT1664(auVar353);
              auVar34 = vshufps_avx(local_178,local_178,0x55);
              auVar87 = vblendvps_avx(auVar87,auVar34,auVar24);
              auVar34 = vshufps_avx(local_178,local_178,0xaa);
              auVar34 = vblendvps_avx(in_ZMM14._0_16_,auVar34,auVar24);
              in_ZMM14 = ZEXT1664(auVar34);
              uVar22 = local_168._0_4_;
              auVar330._4_4_ = uVar22;
              auVar330._0_4_ = uVar22;
              auVar330._8_4_ = uVar22;
              auVar330._12_4_ = uVar22;
              _local_2f8 = vblendvps_avx(_local_2f8,auVar330,auVar24);
              auVar71 = vshufps_avx(local_168,local_168,0x55);
              auVar71 = vblendvps_avx(in_ZMM13._0_16_,auVar71,auVar24);
              in_ZMM13 = ZEXT1664(auVar71);
              auVar91 = vshufps_avx(local_168,local_168,0xaa);
              auVar90 = vblendvps_avx(auVar90,auVar91,auVar24);
              uVar17 = vmovmskps_avx(_local_318);
            } while (uVar17 != 0);
          }
          auVar304._8_4_ = 0x3f800000;
          auVar304._0_8_ = &DAT_3f8000003f800000;
          auVar304._12_4_ = 0x3f800000;
          auVar24 = vsubps_avx(auVar304,auVar89);
          fVar23 = auVar89._0_4_;
          auVar290._0_4_ = auVar289._0_4_ * fVar23;
          fVar65 = auVar89._4_4_;
          auVar290._4_4_ = auVar289._4_4_ * fVar65;
          fVar66 = auVar89._8_4_;
          auVar290._8_4_ = auVar289._8_4_ * fVar66;
          fVar67 = auVar89._12_4_;
          auVar290._12_4_ = auVar289._12_4_ * fVar67;
          auVar273 = vfmadd231ps_fma(auVar290,auVar24,auVar273);
          auVar274._0_4_ = fVar23 * auVar115._0_4_;
          auVar274._4_4_ = fVar65 * auVar115._4_4_;
          auVar274._8_4_ = fVar66 * auVar115._8_4_;
          auVar274._12_4_ = fVar67 * auVar115._12_4_;
          auVar35 = vfmadd231ps_fma(auVar274,auVar24,auVar35);
          auVar239._0_4_ = fVar23 * auVar33._0_4_;
          auVar239._4_4_ = fVar65 * auVar33._4_4_;
          auVar239._8_4_ = fVar66 * auVar33._8_4_;
          auVar239._12_4_ = fVar67 * auVar33._12_4_;
          auVar33 = vfmadd231ps_fma(auVar239,auVar24,_local_388);
          auVar252._0_4_ = fVar23 * auVar225._0_4_;
          auVar252._4_4_ = fVar65 * auVar225._4_4_;
          auVar252._8_4_ = fVar66 * auVar225._8_4_;
          auVar252._12_4_ = fVar67 * auVar225._12_4_;
          auVar289 = vfmadd231ps_fma(auVar252,auVar24,_local_378);
          auVar226._0_4_ = fVar23 * auVar88._0_4_;
          auVar226._4_4_ = fVar65 * auVar88._4_4_;
          auVar226._8_4_ = fVar66 * auVar88._8_4_;
          auVar226._12_4_ = fVar67 * auVar88._12_4_;
          auVar115 = vfmadd231ps_fma(auVar226,auVar24,_local_2d8);
          auVar155._0_4_ = fVar23 * auVar86._0_4_;
          auVar155._4_4_ = fVar65 * auVar86._4_4_;
          auVar155._8_4_ = fVar66 * auVar86._8_4_;
          auVar155._12_4_ = fVar67 * auVar86._12_4_;
          auVar86 = vfmadd231ps_fma(auVar155,auVar24,_local_328);
          auVar201._0_4_ = auVar353._0_4_ * fVar23;
          auVar201._4_4_ = auVar353._4_4_ * fVar65;
          auVar201._8_4_ = auVar353._8_4_ * fVar66;
          auVar201._12_4_ = auVar353._12_4_ * fVar67;
          auVar225 = vfmadd231ps_fma(auVar201,auVar24,_local_368);
          auVar111._0_4_ = fVar23 * auVar87._0_4_;
          auVar111._4_4_ = fVar65 * auVar87._4_4_;
          auVar111._8_4_ = fVar66 * auVar87._8_4_;
          auVar111._12_4_ = fVar67 * auVar87._12_4_;
          auVar353 = vfmadd231ps_fma(auVar111,auVar24,_local_308);
          auVar354._0_4_ = auVar34._0_4_ * fVar23;
          auVar354._4_4_ = auVar34._4_4_ * fVar65;
          auVar354._8_4_ = auVar34._8_4_ * fVar66;
          auVar354._12_4_ = auVar34._12_4_ * fVar67;
          auVar34 = vfmadd231ps_fma(auVar354,auVar24,_local_358);
          auVar305._0_4_ = fVar23 * (float)local_2f8._0_4_;
          auVar305._4_4_ = fVar65 * (float)local_2f8._4_4_;
          auVar305._8_4_ = fVar66 * (float)uStack_2f0;
          auVar305._12_4_ = fVar67 * uStack_2f0._4_4_;
          auVar311._0_4_ = auVar71._0_4_ * fVar23;
          auVar311._4_4_ = auVar71._4_4_ * fVar65;
          auVar311._8_4_ = auVar71._8_4_ * fVar66;
          auVar311._12_4_ = auVar71._12_4_ * fVar67;
          auVar342._0_4_ = fVar23 * auVar90._0_4_;
          auVar342._4_4_ = fVar65 * auVar90._4_4_;
          auVar342._8_4_ = fVar66 * auVar90._8_4_;
          auVar342._12_4_ = fVar67 * auVar90._12_4_;
          auVar71 = vfmadd231ps_fma(auVar305,auVar24,_local_338);
          auVar87 = vfmadd231ps_fma(auVar311,auVar24,_local_2e8);
          auVar24 = vfmadd231ps_fma(auVar342,auVar24,_local_348);
          auVar32._0_4_ = auVar353._0_4_ * auVar86._0_4_;
          auVar32._4_4_ = auVar353._4_4_ * auVar86._4_4_;
          auVar32._8_4_ = auVar353._8_4_ * auVar86._8_4_;
          auVar32._12_4_ = auVar353._12_4_ * auVar86._12_4_;
          auVar88 = vfmsub231ps_fma(auVar32,auVar115,auVar34);
          auVar140._0_4_ = auVar34._0_4_ * auVar289._0_4_;
          auVar140._4_4_ = auVar34._4_4_ * auVar289._4_4_;
          auVar140._8_4_ = auVar34._8_4_ * auVar289._8_4_;
          auVar140._12_4_ = auVar34._12_4_ * auVar289._12_4_;
          auVar89 = vfmsub231ps_fma(auVar140,auVar86,auVar225);
          auVar349._0_4_ = auVar225._0_4_ * auVar115._0_4_;
          auVar349._4_4_ = auVar225._4_4_ * auVar115._4_4_;
          auVar349._8_4_ = auVar225._8_4_ * auVar115._8_4_;
          auVar349._12_4_ = auVar225._12_4_ * auVar115._12_4_;
          auVar90 = vfmsub231ps_fma(auVar349,auVar289,auVar353);
          fVar23 = auVar33._0_4_;
          auVar69._0_4_ = fVar23 * auVar225._0_4_;
          fVar65 = auVar33._4_4_;
          auVar69._4_4_ = fVar65 * auVar225._4_4_;
          fVar66 = auVar33._8_4_;
          auVar69._8_4_ = fVar66 * auVar225._8_4_;
          fVar67 = auVar33._12_4_;
          auVar69._12_4_ = fVar67 * auVar225._12_4_;
          auVar91 = vfmsub231ps_fma(auVar69,auVar273,auVar34);
          auVar355._0_4_ = auVar35._0_4_ * auVar34._0_4_;
          auVar355._4_4_ = auVar35._4_4_ * auVar34._4_4_;
          auVar355._8_4_ = auVar35._8_4_ * auVar34._8_4_;
          auVar355._12_4_ = auVar35._12_4_ * auVar34._12_4_;
          auVar34 = vfmsub231ps_fma(auVar355,auVar353,auVar33);
          auVar112._0_4_ = auVar273._0_4_ * auVar353._0_4_;
          auVar112._4_4_ = auVar273._4_4_ * auVar353._4_4_;
          auVar112._8_4_ = auVar273._8_4_ * auVar353._8_4_;
          auVar112._12_4_ = auVar273._12_4_ * auVar353._12_4_;
          auVar225 = vfmsub231ps_fma(auVar112,auVar35,auVar225);
          auVar202._0_4_ = auVar115._0_4_ * fVar23;
          auVar202._4_4_ = auVar115._4_4_ * fVar65;
          auVar202._8_4_ = auVar115._8_4_ * fVar66;
          auVar202._12_4_ = auVar115._12_4_ * fVar67;
          auVar353 = vfmsub231ps_fma(auVar202,auVar35,auVar86);
          auVar156._0_4_ = auVar273._0_4_ * auVar86._0_4_;
          auVar156._4_4_ = auVar273._4_4_ * auVar86._4_4_;
          auVar156._8_4_ = auVar273._8_4_ * auVar86._8_4_;
          auVar156._12_4_ = auVar273._12_4_ * auVar86._12_4_;
          auVar148 = vfmsub231ps_fma(auVar156,auVar33,auVar289);
          auVar253._0_4_ = auVar289._0_4_ * auVar35._0_4_;
          auVar253._4_4_ = auVar289._4_4_ * auVar35._4_4_;
          auVar253._8_4_ = auVar289._8_4_ * auVar35._8_4_;
          auVar253._12_4_ = auVar289._12_4_ * auVar35._12_4_;
          auVar289 = vfmsub231ps_fma(auVar253,auVar273,auVar115);
          auVar227._0_4_ = auVar90._0_4_ * fVar23;
          auVar227._4_4_ = auVar90._4_4_ * fVar65;
          auVar227._8_4_ = auVar90._8_4_ * fVar66;
          auVar227._12_4_ = auVar90._12_4_ * fVar67;
          auVar33 = vfmadd231ps_fma(auVar227,auVar89,auVar35);
          auVar273 = vfmadd231ps_fma(auVar33,auVar88,auVar273);
          auVar33 = vdivps_avx(auVar88,auVar273);
          _local_378 = vdivps_avx(auVar34,auVar273);
          _local_388 = vdivps_avx(auVar353,auVar273);
          auVar86 = vdivps_avx(auVar89,auVar273);
          _local_358 = vdivps_avx(auVar91,auVar273);
          _local_368 = vdivps_avx(auVar148,auVar273);
          auVar34 = vdivps_avx(auVar90,auVar273);
          auVar35 = vdivps_avx(auVar225,auVar273);
          auVar273 = vdivps_avx(auVar289,auVar273);
          fVar23 = auVar24._0_4_;
          auVar113._0_4_ = fVar23 * auVar34._0_4_;
          fVar65 = auVar24._4_4_;
          auVar113._4_4_ = fVar65 * auVar34._4_4_;
          fVar66 = auVar24._8_4_;
          auVar113._8_4_ = fVar66 * auVar34._8_4_;
          fVar67 = auVar24._12_4_;
          auVar113._12_4_ = fVar67 * auVar34._12_4_;
          auVar254._0_4_ = fVar23 * auVar35._0_4_;
          auVar254._4_4_ = fVar65 * auVar35._4_4_;
          auVar254._8_4_ = fVar66 * auVar35._8_4_;
          auVar254._12_4_ = fVar67 * auVar35._12_4_;
          auVar275._0_4_ = fVar23 * auVar273._0_4_;
          auVar275._4_4_ = fVar65 * auVar273._4_4_;
          auVar275._8_4_ = fVar66 * auVar273._8_4_;
          auVar275._12_4_ = fVar67 * auVar273._12_4_;
          auVar289 = vfmadd231ps_fma(auVar113,auVar87,auVar86);
          auVar115 = vfmadd231ps_fma(auVar254,auVar87,_local_358);
          auVar225 = vfmadd231ps_fma(auVar275,_local_368,auVar87);
          auVar289 = vfmadd231ps_fma(auVar289,auVar71,auVar33);
          auVar115 = vfmadd231ps_fma(auVar115,auVar71,_local_378);
          auVar225 = vfmadd231ps_fma(auVar225,_local_388,auVar71);
          auVar306._0_8_ = auVar289._0_8_ ^ 0x8000000080000000;
          auVar306._8_4_ = auVar289._8_4_ ^ 0x80000000;
          auVar306._12_4_ = auVar289._12_4_ ^ 0x80000000;
          auVar291._0_8_ = auVar115._0_8_ ^ 0x8000000080000000;
          auVar291._8_4_ = auVar115._8_4_ ^ 0x80000000;
          auVar291._12_4_ = auVar115._12_4_ ^ 0x80000000;
          auVar276._0_8_ = auVar225._0_8_ ^ 0x8000000080000000;
          auVar276._8_4_ = auVar225._8_4_ ^ 0x80000000;
          auVar276._12_4_ = auVar225._12_4_ ^ 0x80000000;
        }
        auVar289 = *(undefined1 (*) [16])ray;
        auVar115 = *(undefined1 (*) [16])(ray + 0x10);
        auVar225 = *(undefined1 (*) [16])(ray + 0x20);
        auVar353 = vfmadd231ps_fma(auVar306,auVar225,auVar34);
        auVar353 = vfmadd231ps_fma(auVar353,auVar115,auVar86);
        auVar24 = vfmadd231ps_fma(auVar353,auVar289,auVar33);
        auVar353 = *(undefined1 (*) [16])(ray + 0x40);
        auVar71 = *(undefined1 (*) [16])(ray + 0x50);
        pRVar1 = ray + 0x60;
        fVar23 = *(float *)pRVar1;
        fVar65 = *(float *)(ray + 100);
        fVar66 = *(float *)(ray + 0x68);
        auVar11 = *(undefined1 (*) [12])pRVar1;
        fVar67 = *(float *)(ray + 0x6c);
        auVar87 = *(undefined1 (*) [16])pRVar1;
        *(undefined1 (*) [16])ray = auVar24;
        auVar24 = vfmadd231ps_fma(auVar291,auVar225,auVar35);
        auVar24 = vfmadd231ps_fma(auVar24,auVar115,_local_358);
        auVar24 = vfmadd231ps_fma(auVar24,auVar289,_local_378);
        *(undefined1 (*) [16])(ray + 0x10) = auVar24;
        auVar24 = vfmadd231ps_fma(auVar276,auVar225,auVar273);
        auVar24 = vfmadd231ps_fma(auVar24,auVar115,_local_368);
        auVar24 = vfmadd231ps_fma(auVar24,auVar289,_local_388);
        *(undefined1 (*) [16])(ray + 0x20) = auVar24;
        auVar114._0_4_ = auVar34._0_4_ * fVar23;
        auVar114._4_4_ = auVar34._4_4_ * fVar65;
        auVar114._8_4_ = auVar34._8_4_ * fVar66;
        auVar114._12_4_ = auVar34._12_4_ * fVar67;
        auVar86 = vfmadd231ps_fma(auVar114,auVar71,auVar86);
        auVar157._0_4_ = auVar35._0_4_ * fVar23;
        auVar157._4_4_ = auVar35._4_4_ * fVar65;
        auVar157._8_4_ = auVar35._8_4_ * fVar66;
        auVar157._12_4_ = auVar35._12_4_ * fVar67;
        auVar34 = vfmadd231ps_fma(auVar157,auVar71,_local_358);
        auVar70._0_4_ = auVar273._0_4_ * fVar23;
        auVar70._4_4_ = auVar273._4_4_ * fVar65;
        auVar70._8_4_ = auVar273._8_4_ * fVar66;
        auVar70._12_4_ = auVar273._12_4_ * fVar67;
        auVar273 = vfmadd231ps_fma(auVar70,auVar71,_local_368);
        auVar33 = vfmadd231ps_fma(auVar86,auVar353,auVar33);
        auVar86 = vfmadd231ps_fma(auVar34,auVar353,_local_378);
        auVar34 = vfmadd231ps_fma(auVar273,auVar353,_local_388);
        *(undefined1 (*) [16])(ray + 0x40) = auVar33;
        *(undefined1 (*) [16])(ray + 0x50) = auVar86;
        *(undefined1 (*) [16])(ray + 0x60) = auVar34;
        local_88 = context->args;
        local_28 = local_38._0_8_;
        uStack_20 = local_38._8_8_;
        local_98._8_8_ = pRVar5;
        local_98._0_8_ = p_Var15;
        local_38 = auVar13;
        (**(code **)(p_Var15 + 0xa0))(&local_28,p_Var15 + 0x58,ray);
        local_2e8 = auVar289._0_8_;
        uStack_2e0 = auVar289._8_8_;
        *(undefined1 (*) [8])ray = local_2e8;
        *(undefined8 *)(ray + 8) = uStack_2e0;
        local_328 = auVar115._0_8_;
        uStack_320 = auVar115._8_8_;
        *(undefined1 (*) [8])(ray + 0x10) = local_328;
        *(undefined8 *)(ray + 0x18) = uStack_320;
        local_358 = auVar225._0_8_;
        uStack_350 = auVar225._8_8_;
        *(undefined1 (*) [8])(ray + 0x20) = local_358;
        *(undefined8 *)(ray + 0x28) = uStack_350;
        local_348 = auVar353._0_8_;
        uStack_340 = auVar353._8_8_;
        *(undefined1 (*) [8])(ray + 0x40) = local_348;
        *(undefined8 *)(ray + 0x48) = uStack_340;
        local_338 = auVar71._0_8_;
        uStack_330 = auVar71._8_8_;
        *(undefined1 (*) [8])(ray + 0x50) = local_338;
        *(undefined8 *)(ray + 0x58) = uStack_330;
        local_2f8 = auVar11._0_8_;
        uStack_2f0 = auVar87._8_8_;
        *(undefined1 (*) [8])(ray + 0x60) = local_2f8;
        *(undefined8 *)(ray + 0x68) = uStack_2f0;
        auVar33 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x40,1);
        *(undefined1 (*) [16])this = auVar33;
        pRVar5->instID[0] = 0xffffffff;
        pRVar5->instPrimID[0] = 0xffffffff;
        pGVar16 = extraout_RDX;
      }
      goto LAB_006fd4fa;
    }
  }
  *(undefined8 *)this = mm_lookupmask_ps._0_8_;
  *(undefined8 *)(this + 8) = uVar12;
LAB_006fd4fa:
  vVar361.field_0._8_8_ = pGVar16;
  vVar361.field_0._0_8_ = this;
  return (vbool<4>)vVar361.field_0;
}

Assistant:

vbool<K> InstanceArrayIntersectorKMB<K>::occluded(const vbool<K>& valid_i, const Precalculations& pre, RayK<K>& ray, RayQueryContext* context, const Primitive& prim)
    {
      vbool<K> valid = valid_i;
      const InstanceArray* instance = context->scene->get<InstanceArray>(prim.instID_);
      Accel* object = instance->getObject(prim.primID_);
      if (!object) return false;

      /* perform ray mask test */
#if defined(EMBREE_RAY_MASK)
      valid &= (ray.mask & instance->mask) != 0;
      if (none(valid)) return false;
#endif
        
      RTCRayQueryContext* user_context = context->user;
      vbool<K> occluded = false;
      if (likely(instance_id_stack::push(user_context, prim.instID_, prim.primID_)))
      {
        AffineSpace3vf<K> world2local = instance->getWorld2Local<K>(prim.primID_, valid, ray.time());
        const Vec3vf<K> ray_org = ray.org;
        const Vec3vf<K> ray_dir = ray.dir;
        ray.org = xfmPoint(world2local, ray_org);
        ray.dir = xfmVector(world2local, ray_dir);
        RayQueryContext newcontext((Scene*)object, user_context, context->args);
        object->intersectors.occluded(valid, ray, &newcontext);
        ray.org = ray_org;
        ray.dir = ray_dir;
        occluded = ray.tfar < 0.0f;
        instance_id_stack::pop(user_context);
      }
      return occluded;
    }